

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined8 in_R10;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  float fVar99;
  vint4 bi_2;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined4 uVar106;
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar113 [16];
  float fVar124;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  vint4 ai_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar134;
  float fVar139;
  float fVar140;
  vint4 bi;
  float fVar141;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 ai_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  vfloat4 a0_3;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  vfloat4 a0_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar201;
  float fVar211;
  float fVar213;
  float fVar215;
  undefined1 auVar202 [16];
  float fVar212;
  float fVar214;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  float fVar217;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  vfloat4 a0;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  vfloat4 a0_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint auStack_620 [4];
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar24;
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  
  uVar23 = (ulong)(byte)prim[1];
  fVar99 = *(float *)(prim + uVar23 * 0x19 + 0x12);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar37 = vsubps_avx(auVar37,*(undefined1 (*) [16])(prim + uVar23 * 0x19 + 6));
  auVar55._0_4_ = fVar99 * auVar37._0_4_;
  auVar55._4_4_ = fVar99 * auVar37._4_4_;
  auVar55._8_4_ = fVar99 * auVar37._8_4_;
  auVar55._12_4_ = fVar99 * auVar37._12_4_;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 4 + 6)));
  auVar44._0_4_ = fVar99 * auVar38._0_4_;
  auVar44._4_4_ = fVar99 * auVar38._4_4_;
  auVar44._8_4_ = fVar99 * auVar38._8_4_;
  auVar44._12_4_ = fVar99 * auVar38._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 5 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xb + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xc + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xd + 6)));
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x12 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x13 + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x14 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar61._4_4_ = auVar44._0_4_;
  auVar61._0_4_ = auVar44._0_4_;
  auVar61._8_4_ = auVar44._0_4_;
  auVar61._12_4_ = auVar44._0_4_;
  auVar43 = vshufps_avx(auVar44,auVar44,0x55);
  auVar40 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar99 = auVar40._0_4_;
  auVar58._0_4_ = fVar99 * auVar39._0_4_;
  fVar216 = auVar40._4_4_;
  auVar58._4_4_ = fVar216 * auVar39._4_4_;
  fVar201 = auVar40._8_4_;
  auVar58._8_4_ = fVar201 * auVar39._8_4_;
  fVar212 = auVar40._12_4_;
  auVar58._12_4_ = fVar212 * auVar39._12_4_;
  auVar47._0_4_ = auVar49._0_4_ * fVar99;
  auVar47._4_4_ = auVar49._4_4_ * fVar216;
  auVar47._8_4_ = auVar49._8_4_ * fVar201;
  auVar47._12_4_ = auVar49._12_4_ * fVar212;
  auVar45._0_4_ = fVar99 * auVar10._0_4_;
  auVar45._4_4_ = fVar216 * auVar10._4_4_;
  auVar45._8_4_ = fVar201 * auVar10._8_4_;
  auVar45._12_4_ = fVar212 * auVar10._12_4_;
  auVar40 = vfmadd231ps_fma(auVar58,auVar43,auVar38);
  auVar41 = vfmadd231ps_fma(auVar47,auVar43,auVar50);
  auVar43 = vfmadd231ps_fma(auVar45,auVar48,auVar43);
  auVar42 = vfmadd231ps_fma(auVar40,auVar61,auVar37);
  auVar41 = vfmadd231ps_fma(auVar41,auVar61,auVar51);
  auVar44 = vfmadd231ps_fma(auVar43,auVar9,auVar61);
  auVar228._4_4_ = auVar55._0_4_;
  auVar228._0_4_ = auVar55._0_4_;
  auVar228._8_4_ = auVar55._0_4_;
  auVar228._12_4_ = auVar55._0_4_;
  auVar43 = vshufps_avx(auVar55,auVar55,0x55);
  auVar40 = vshufps_avx(auVar55,auVar55,0xaa);
  fVar99 = auVar40._0_4_;
  auVar60._0_4_ = fVar99 * auVar39._0_4_;
  fVar216 = auVar40._4_4_;
  auVar60._4_4_ = fVar216 * auVar39._4_4_;
  fVar201 = auVar40._8_4_;
  auVar60._8_4_ = fVar201 * auVar39._8_4_;
  fVar212 = auVar40._12_4_;
  auVar60._12_4_ = fVar212 * auVar39._12_4_;
  auVar57._0_4_ = fVar99 * auVar49._0_4_;
  auVar57._4_4_ = fVar216 * auVar49._4_4_;
  auVar57._8_4_ = fVar201 * auVar49._8_4_;
  auVar57._12_4_ = fVar212 * auVar49._12_4_;
  auVar54._0_4_ = fVar99 * auVar10._0_4_;
  auVar54._4_4_ = fVar216 * auVar10._4_4_;
  auVar54._8_4_ = fVar201 * auVar10._8_4_;
  auVar54._12_4_ = fVar212 * auVar10._12_4_;
  auVar38 = vfmadd231ps_fma(auVar60,auVar43,auVar38);
  auVar39 = vfmadd231ps_fma(auVar57,auVar43,auVar50);
  auVar50 = vfmadd231ps_fma(auVar54,auVar43,auVar48);
  auVar49 = vfmadd231ps_fma(auVar38,auVar228,auVar37);
  auVar48 = vfmadd231ps_fma(auVar39,auVar228,auVar51);
  auVar10 = vfmadd231ps_fma(auVar50,auVar228,auVar9);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar245 = ZEXT1664(auVar37);
  auVar38 = vandps_avx512vl(auVar42,auVar37);
  auVar53._8_4_ = 0x219392ef;
  auVar53._0_8_ = 0x219392ef219392ef;
  auVar53._12_4_ = 0x219392ef;
  uVar29 = vcmpps_avx512vl(auVar38,auVar53,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar40._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar42._12_4_;
  auVar38 = vandps_avx512vl(auVar41,auVar37);
  uVar29 = vcmpps_avx512vl(auVar38,auVar53,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar42._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar41._12_4_;
  auVar37 = vandps_avx512vl(auVar44,auVar37);
  uVar29 = vcmpps_avx512vl(auVar37,auVar53,1);
  bVar31 = (bool)((byte)uVar29 & 1);
  auVar41._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._0_4_;
  bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._4_4_;
  bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._8_4_;
  bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar44._12_4_;
  auVar37 = vrcp14ps_avx512vl(auVar40);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar246 = ZEXT1664(auVar38);
  auVar39 = vfnmadd213ps_avx512vl(auVar40,auVar37,auVar38);
  auVar51 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar42);
  auVar39 = vfnmadd213ps_avx512vl(auVar42,auVar37,auVar38);
  auVar50 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
  auVar39 = vrcp14ps_avx512vl(auVar41);
  auVar38 = vfnmadd213ps_avx512vl(auVar41,auVar39,auVar38);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar23 * 7 + 6);
  auVar37 = vpmovsxwd_avx(auVar37);
  auVar9 = vfmadd132ps_fma(auVar38,auVar39,auVar39);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar39 = vsubps_avx(auVar37,auVar49);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar23 * 9 + 6);
  auVar37 = vpmovsxwd_avx(auVar38);
  auVar52._0_4_ = auVar51._0_4_ * auVar39._0_4_;
  auVar52._4_4_ = auVar51._4_4_ * auVar39._4_4_;
  auVar52._8_4_ = auVar51._8_4_ * auVar39._8_4_;
  auVar52._12_4_ = auVar51._12_4_ * auVar39._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vsubps_avx(auVar37,auVar49);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar23 * 0xe + 6);
  auVar37 = vpmovsxwd_avx(auVar39);
  auVar62._0_4_ = auVar51._0_4_ * auVar38._0_4_;
  auVar62._4_4_ = auVar51._4_4_ * auVar38._4_4_;
  auVar62._8_4_ = auVar51._8_4_ * auVar38._8_4_;
  auVar62._12_4_ = auVar51._12_4_ * auVar38._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar48);
  auVar59._0_4_ = auVar50._0_4_ * auVar37._0_4_;
  auVar59._4_4_ = auVar50._4_4_ * auVar37._4_4_;
  auVar59._8_4_ = auVar50._8_4_ * auVar37._8_4_;
  auVar59._12_4_ = auVar50._12_4_ * auVar37._12_4_;
  auVar39 = vpbroadcastd_avx512vl();
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar37 = vpmovsxwd_avx(auVar51);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar48);
  auVar63._0_4_ = auVar50._0_4_ * auVar37._0_4_;
  auVar63._4_4_ = auVar50._4_4_ * auVar37._4_4_;
  auVar63._8_4_ = auVar50._8_4_ * auVar37._8_4_;
  auVar63._12_4_ = auVar50._12_4_ * auVar37._12_4_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar23 * 0x15 + 6);
  auVar37 = vpmovsxwd_avx(auVar50);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar10);
  auVar56._0_4_ = auVar9._0_4_ * auVar37._0_4_;
  auVar56._4_4_ = auVar9._4_4_ * auVar37._4_4_;
  auVar56._8_4_ = auVar9._8_4_ * auVar37._8_4_;
  auVar56._12_4_ = auVar9._12_4_ * auVar37._12_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar23 * 0x17 + 6);
  auVar37 = vpmovsxwd_avx(auVar49);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar10);
  auVar46._0_4_ = auVar9._0_4_ * auVar37._0_4_;
  auVar46._4_4_ = auVar9._4_4_ * auVar37._4_4_;
  auVar46._8_4_ = auVar9._8_4_ * auVar37._8_4_;
  auVar46._12_4_ = auVar9._12_4_ * auVar37._12_4_;
  auVar37 = vpminsd_avx(auVar52,auVar62);
  auVar38 = vpminsd_avx(auVar59,auVar63);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar38 = vpminsd_avx(auVar56,auVar46);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar9._4_4_ = uVar106;
  auVar9._0_4_ = uVar106;
  auVar9._8_4_ = uVar106;
  auVar9._12_4_ = uVar106;
  auVar38 = vmaxps_avx512vl(auVar38,auVar9);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar48._8_4_ = 0x3f7ffffa;
  auVar48._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar48._12_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar37,auVar48);
  auVar37 = vpmaxsd_avx(auVar52,auVar62);
  auVar38 = vpmaxsd_avx(auVar59,auVar63);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar38 = vpmaxsd_avx(auVar56,auVar46);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar10._4_4_ = uVar106;
  auVar10._0_4_ = uVar106;
  auVar10._8_4_ = uVar106;
  auVar10._12_4_ = uVar106;
  auVar38 = vminps_avx512vl(auVar38,auVar10);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar43._8_4_ = 0x3f800003;
  auVar43._0_8_ = 0x3f8000033f800003;
  auVar43._12_4_ = 0x3f800003;
  auVar37 = vmulps_avx512vl(auVar37,auVar43);
  uVar11 = vcmpps_avx512vl(local_5a0,auVar37,2);
  uVar12 = vpcmpgtd_avx512vl(auVar39,_DAT_01f4ad30);
  uVar29 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)((byte)uVar11 & 0xf & (byte)uVar12));
  auVar105 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar105);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar248 = ZEXT1664(auVar37);
  auVar105 = ZEXT464(0x3f800000);
LAB_0181af50:
  if (uVar29 == 0) {
LAB_0181cb69:
    return uVar29 != 0;
  }
  lVar25 = 0;
  for (uVar23 = uVar29; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar3 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  uVar23 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar25 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar37 = *(undefined1 (*) [16])(_Var8 + uVar23 * (long)pvVar7);
  auVar38 = *(undefined1 (*) [16])(_Var8 + (uVar23 + 1) * (long)pvVar7);
  auVar39 = *(undefined1 (*) [16])(_Var8 + (uVar23 + 2) * (long)pvVar7);
  auVar51 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar23 + 3));
  lVar25 = *(long *)&pGVar5[1].time_range.upper;
  auVar50 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * uVar23);
  auVar49 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar23 + 1));
  auVar9 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar23 + 2));
  uVar30 = uVar29 - 1 & uVar29;
  auVar48 = *(undefined1 (*) [16])(lVar25 + (long)p_Var6 * (uVar23 + 3));
  if (uVar30 != 0) {
    uVar28 = uVar30 - 1 & uVar30;
    for (uVar23 = uVar30; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    }
    if (uVar28 != 0) {
      for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar54 = auVar248._0_16_;
  auVar40 = vmulps_avx512vl(auVar48,auVar54);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar9,auVar40);
  auVar107._0_4_ = auVar49._0_4_ + auVar43._0_4_;
  auVar107._4_4_ = auVar49._4_4_ + auVar43._4_4_;
  auVar107._8_4_ = auVar49._8_4_ + auVar43._8_4_;
  auVar107._12_4_ = auVar49._12_4_ + auVar43._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar107,auVar50,auVar54);
  auVar63 = ZEXT816(0) << 0x40;
  auVar113._0_4_ = auVar48._0_4_ * 0.0;
  auVar113._4_4_ = auVar48._4_4_ * 0.0;
  auVar113._8_4_ = auVar48._8_4_ * 0.0;
  auVar113._12_4_ = auVar48._12_4_ * 0.0;
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar43 = vfmadd231ps_avx512vl(auVar113,auVar9,auVar42);
  auVar43 = vfmadd231ps_fma(auVar43,auVar49,auVar63);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar50,auVar42);
  auVar45 = vmulps_avx512vl(auVar51,auVar54);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar39,auVar45);
  auVar229._0_4_ = auVar43._0_4_ + auVar38._0_4_;
  auVar229._4_4_ = auVar43._4_4_ + auVar38._4_4_;
  auVar229._8_4_ = auVar43._8_4_ + auVar38._8_4_;
  auVar229._12_4_ = auVar43._12_4_ + auVar38._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar229,auVar37,auVar54);
  auVar233._0_4_ = auVar51._0_4_ * 0.0;
  auVar233._4_4_ = auVar51._4_4_ * 0.0;
  auVar233._8_4_ = auVar51._8_4_ * 0.0;
  auVar233._12_4_ = auVar51._12_4_ * 0.0;
  auVar43 = vfmadd231ps_avx512vl(auVar233,auVar39,auVar42);
  auVar43 = vfmadd231ps_fma(auVar43,auVar38,auVar63);
  auVar47 = vfnmadd231ps_avx512vl(auVar43,auVar37,auVar42);
  auVar125._0_4_ = auVar9._0_4_ + auVar40._0_4_;
  auVar125._4_4_ = auVar9._4_4_ + auVar40._4_4_;
  auVar125._8_4_ = auVar9._8_4_ + auVar40._8_4_;
  auVar125._12_4_ = auVar9._12_4_ + auVar40._12_4_;
  auVar43 = vfmadd231ps_fma(auVar125,auVar49,auVar63);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar54);
  auVar48 = vmulps_avx512vl(auVar48,auVar42);
  auVar9 = vfmadd231ps_fma(auVar48,auVar63,auVar9);
  auVar49 = vfnmadd231ps_avx512vl(auVar9,auVar42,auVar49);
  auVar9 = vfmadd231ps_fma(auVar49,auVar63,auVar50);
  auVar182._0_4_ = auVar45._0_4_ + auVar39._0_4_;
  auVar182._4_4_ = auVar45._4_4_ + auVar39._4_4_;
  auVar182._8_4_ = auVar45._8_4_ + auVar39._8_4_;
  auVar182._12_4_ = auVar45._12_4_ + auVar39._12_4_;
  auVar50 = vfmadd231ps_fma(auVar182,auVar38,auVar63);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar37,auVar54);
  auVar51 = vmulps_avx512vl(auVar51,auVar42);
  auVar39 = vfmadd231ps_fma(auVar51,auVar63,auVar39);
  auVar38 = vfnmadd231ps_avx512vl(auVar39,auVar42,auVar38);
  auVar49 = vfmadd231ps_fma(auVar38,auVar63,auVar37);
  auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar38 = vshufps_avx(auVar46,auVar46,0xc9);
  fVar214 = auVar44._0_4_;
  auVar152._0_4_ = fVar214 * auVar38._0_4_;
  fVar122 = auVar44._4_4_;
  auVar152._4_4_ = fVar122 * auVar38._4_4_;
  fVar123 = auVar44._8_4_;
  auVar152._8_4_ = fVar123 * auVar38._8_4_;
  fVar124 = auVar44._12_4_;
  auVar152._12_4_ = fVar124 * auVar38._12_4_;
  auVar38 = vfmsub231ps_fma(auVar152,auVar37,auVar46);
  auVar39 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar153._0_4_ = fVar214 * auVar38._0_4_;
  auVar153._4_4_ = fVar122 * auVar38._4_4_;
  auVar153._8_4_ = fVar123 * auVar38._8_4_;
  auVar153._12_4_ = fVar124 * auVar38._12_4_;
  auVar37 = vfmsub231ps_fma(auVar153,auVar37,auVar47);
  auVar51 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar38 = vshufps_avx(auVar50,auVar50,0xc9);
  fVar134 = auVar9._0_4_;
  auVar142._0_4_ = fVar134 * auVar38._0_4_;
  fVar139 = auVar9._4_4_;
  auVar142._4_4_ = fVar139 * auVar38._4_4_;
  fVar140 = auVar9._8_4_;
  auVar142._8_4_ = fVar140 * auVar38._8_4_;
  fVar141 = auVar9._12_4_;
  auVar142._12_4_ = fVar141 * auVar38._12_4_;
  auVar38 = vfmsub231ps_fma(auVar142,auVar37,auVar50);
  auVar50 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar183._0_4_ = auVar38._0_4_ * fVar134;
  auVar183._4_4_ = auVar38._4_4_ * fVar139;
  auVar183._8_4_ = auVar38._8_4_ * fVar140;
  auVar183._12_4_ = auVar38._12_4_ * fVar141;
  auVar37 = vfmsub231ps_fma(auVar183,auVar37,auVar49);
  auVar49 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar39,auVar39,0x7f);
  fVar216 = auVar37._0_4_;
  auVar184._4_12_ = ZEXT812(0) << 0x20;
  auVar184._0_4_ = fVar216;
  auVar38 = vrsqrt14ss_avx512f(auVar63,auVar184);
  auVar48 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar40 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
  fVar99 = auVar38._0_4_;
  fVar99 = auVar48._0_4_ + auVar40._0_4_ * fVar99 * fVar99 * fVar99;
  fVar217 = fVar99 * auVar39._0_4_;
  fVar225 = fVar99 * auVar39._4_4_;
  fVar226 = fVar99 * auVar39._8_4_;
  fVar227 = fVar99 * auVar39._12_4_;
  auVar38 = vdpps_avx(auVar39,auVar51,0x7f);
  auVar195._0_4_ = auVar51._0_4_ * fVar216;
  auVar195._4_4_ = auVar51._4_4_ * fVar216;
  auVar195._8_4_ = auVar51._8_4_ * fVar216;
  auVar195._12_4_ = auVar51._12_4_ * fVar216;
  fVar216 = auVar38._0_4_;
  auVar163._0_4_ = fVar216 * auVar39._0_4_;
  auVar163._4_4_ = fVar216 * auVar39._4_4_;
  auVar163._8_4_ = fVar216 * auVar39._8_4_;
  auVar163._12_4_ = fVar216 * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar195,auVar163);
  auVar38 = vrcp14ss_avx512f(auVar63,auVar184);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar38,ZEXT416(0x40000000));
  fVar201 = auVar38._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar50,auVar50,0x7f);
  fVar212 = auVar37._0_4_;
  auVar176._4_12_ = ZEXT812(0) << 0x20;
  auVar176._0_4_ = fVar212;
  auVar38 = vrsqrt14ss_avx512f(auVar63,auVar176);
  auVar51 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar37,ZEXT416(0xbf000000));
  fVar216 = auVar38._0_4_;
  fVar216 = auVar51._0_4_ + auVar48._0_4_ * fVar216 * fVar216 * fVar216;
  fVar200 = fVar216 * auVar50._0_4_;
  fVar211 = fVar216 * auVar50._4_4_;
  fVar213 = fVar216 * auVar50._8_4_;
  fVar215 = fVar216 * auVar50._12_4_;
  auVar38 = vdpps_avx(auVar50,auVar49,0x7f);
  auVar154._0_4_ = fVar212 * auVar49._0_4_;
  auVar154._4_4_ = fVar212 * auVar49._4_4_;
  auVar154._8_4_ = fVar212 * auVar49._8_4_;
  auVar154._12_4_ = fVar212 * auVar49._12_4_;
  fVar212 = auVar38._0_4_;
  auVar143._0_4_ = fVar212 * auVar50._0_4_;
  auVar143._4_4_ = fVar212 * auVar50._4_4_;
  auVar143._8_4_ = fVar212 * auVar50._8_4_;
  auVar143._12_4_ = fVar212 * auVar50._12_4_;
  auVar51 = vsubps_avx(auVar154,auVar143);
  auVar38 = vrcp14ss_avx512f(auVar63,auVar176);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar38,ZEXT416(0x40000000));
  fVar212 = auVar37._0_4_ * auVar38._0_4_;
  auVar37 = vshufps_avx(auVar41,auVar41,0xff);
  auVar177._0_4_ = fVar217 * auVar37._0_4_;
  auVar177._4_4_ = fVar225 * auVar37._4_4_;
  auVar177._8_4_ = fVar226 * auVar37._8_4_;
  auVar177._12_4_ = fVar227 * auVar37._12_4_;
  local_520 = vsubps_avx(auVar41,auVar177);
  auVar38 = vshufps_avx(auVar44,auVar44,0xff);
  auVar155._0_4_ = auVar38._0_4_ * fVar217 + auVar37._0_4_ * fVar99 * fVar201 * auVar39._0_4_;
  auVar155._4_4_ = auVar38._4_4_ * fVar225 + auVar37._4_4_ * fVar99 * fVar201 * auVar39._4_4_;
  auVar155._8_4_ = auVar38._8_4_ * fVar226 + auVar37._8_4_ * fVar99 * fVar201 * auVar39._8_4_;
  auVar155._12_4_ = auVar38._12_4_ * fVar227 + auVar37._12_4_ * fVar99 * fVar201 * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar44,auVar155);
  local_530._0_4_ = auVar177._0_4_ + auVar41._0_4_;
  local_530._4_4_ = auVar177._4_4_ + auVar41._4_4_;
  fStack_528 = auVar177._8_4_ + auVar41._8_4_;
  fStack_524 = auVar177._12_4_ + auVar41._12_4_;
  auVar37 = vshufps_avx(auVar43,auVar43,0xff);
  auVar156._0_4_ = fVar200 * auVar37._0_4_;
  auVar156._4_4_ = fVar211 * auVar37._4_4_;
  auVar156._8_4_ = fVar213 * auVar37._8_4_;
  auVar156._12_4_ = fVar215 * auVar37._12_4_;
  local_540 = vsubps_avx(auVar43,auVar156);
  auVar38 = vshufps_avx(auVar9,auVar9,0xff);
  auVar114._0_4_ = auVar38._0_4_ * fVar200 + auVar37._0_4_ * fVar216 * auVar51._0_4_ * fVar212;
  auVar114._4_4_ = auVar38._4_4_ * fVar211 + auVar37._4_4_ * fVar216 * auVar51._4_4_ * fVar212;
  auVar114._8_4_ = auVar38._8_4_ * fVar213 + auVar37._8_4_ * fVar216 * auVar51._8_4_ * fVar212;
  auVar114._12_4_ = auVar38._12_4_ * fVar215 + auVar37._12_4_ * fVar216 * auVar51._12_4_ * fVar212;
  auVar37 = vsubps_avx(auVar9,auVar114);
  _local_550 = vaddps_avx512vl(auVar43,auVar156);
  auVar126._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar126._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar126._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar126._12_4_ = auVar39._12_4_ * 0.33333334;
  local_560 = vaddps_avx512vl(local_520,auVar126);
  auVar127._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar127._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar127._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar127._12_4_ = auVar37._12_4_ * 0.33333334;
  local_570 = vsubps_avx512vl(local_540,auVar127);
  auVar108._0_4_ = (fVar214 + auVar155._0_4_) * 0.33333334;
  auVar108._4_4_ = (fVar122 + auVar155._4_4_) * 0.33333334;
  auVar108._8_4_ = (fVar123 + auVar155._8_4_) * 0.33333334;
  auVar108._12_4_ = (fVar124 + auVar155._12_4_) * 0.33333334;
  _local_580 = vaddps_avx512vl(_local_530,auVar108);
  auVar109._0_4_ = (fVar134 + auVar114._0_4_) * 0.33333334;
  auVar109._4_4_ = (fVar139 + auVar114._4_4_) * 0.33333334;
  auVar109._8_4_ = (fVar140 + auVar114._8_4_) * 0.33333334;
  auVar109._12_4_ = (fVar141 + auVar114._12_4_) * 0.33333334;
  _local_590 = vsubps_avx512vl(_local_550,auVar109);
  local_4a0 = vsubps_avx(local_520,auVar10);
  uVar106 = local_4a0._0_4_;
  auVar115._4_4_ = uVar106;
  auVar115._0_4_ = uVar106;
  auVar115._8_4_ = uVar106;
  auVar115._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar38 = vshufps_avx(local_4a0,local_4a0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar99 = pre->ray_space[k].vz.field_0.m128[0];
  fVar216 = pre->ray_space[k].vz.field_0.m128[1];
  fVar201 = pre->ray_space[k].vz.field_0.m128[2];
  fVar212 = pre->ray_space[k].vz.field_0.m128[3];
  auVar110._0_4_ = fVar99 * auVar38._0_4_;
  auVar110._4_4_ = fVar216 * auVar38._4_4_;
  auVar110._8_4_ = fVar201 * auVar38._8_4_;
  auVar110._12_4_ = fVar212 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar2,auVar37);
  auVar48 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar115);
  local_4b0 = vsubps_avx512vl(local_560,auVar10);
  uVar106 = local_4b0._0_4_;
  auVar128._4_4_ = uVar106;
  auVar128._0_4_ = uVar106;
  auVar128._8_4_ = uVar106;
  auVar128._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar38 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar116._0_4_ = fVar99 * auVar38._0_4_;
  auVar116._4_4_ = fVar216 * auVar38._4_4_;
  auVar116._8_4_ = fVar201 * auVar38._8_4_;
  auVar116._12_4_ = fVar212 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar2,auVar37);
  auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar128);
  local_4c0 = vsubps_avx512vl(local_570,auVar10);
  uVar106 = local_4c0._0_4_;
  auVar164._4_4_ = uVar106;
  auVar164._0_4_ = uVar106;
  auVar164._8_4_ = uVar106;
  auVar164._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar38 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar129._0_4_ = fVar99 * auVar38._0_4_;
  auVar129._4_4_ = fVar216 * auVar38._4_4_;
  auVar129._8_4_ = fVar201 * auVar38._8_4_;
  auVar129._12_4_ = fVar212 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar2,auVar37);
  auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar164);
  local_4d0 = vsubps_avx(local_540,auVar10);
  uVar106 = local_4d0._0_4_;
  auVar165._4_4_ = uVar106;
  auVar165._0_4_ = uVar106;
  auVar165._8_4_ = uVar106;
  auVar165._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar38 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar185._0_4_ = auVar38._0_4_ * fVar99;
  auVar185._4_4_ = auVar38._4_4_ * fVar216;
  auVar185._8_4_ = auVar38._8_4_ * fVar201;
  auVar185._12_4_ = auVar38._12_4_ * fVar212;
  auVar37 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar2,auVar37);
  auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar165);
  local_4e0 = vsubps_avx(_local_530,auVar10);
  uVar106 = local_4e0._0_4_;
  auVar166._4_4_ = uVar106;
  auVar166._0_4_ = uVar106;
  auVar166._8_4_ = uVar106;
  auVar166._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar38 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar196._0_4_ = auVar38._0_4_ * fVar99;
  auVar196._4_4_ = auVar38._4_4_ * fVar216;
  auVar196._8_4_ = auVar38._8_4_ * fVar201;
  auVar196._12_4_ = auVar38._12_4_ * fVar212;
  auVar37 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar2,auVar37);
  auVar42 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar166);
  local_4f0 = vsubps_avx512vl(_local_580,auVar10);
  uVar106 = local_4f0._0_4_;
  auVar167._4_4_ = uVar106;
  auVar167._0_4_ = uVar106;
  auVar167._8_4_ = uVar106;
  auVar167._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar38 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar202._0_4_ = auVar38._0_4_ * fVar99;
  auVar202._4_4_ = auVar38._4_4_ * fVar216;
  auVar202._8_4_ = auVar38._8_4_ * fVar201;
  auVar202._12_4_ = auVar38._12_4_ * fVar212;
  auVar37 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar2,auVar37);
  auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar167);
  local_500 = vsubps_avx512vl(_local_590,auVar10);
  uVar106 = local_500._0_4_;
  auVar168._4_4_ = uVar106;
  auVar168._0_4_ = uVar106;
  auVar168._8_4_ = uVar106;
  auVar168._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_500,local_500,0x55);
  auVar38 = vshufps_avx(local_500,local_500,0xaa);
  auVar218._0_4_ = auVar38._0_4_ * fVar99;
  auVar218._4_4_ = auVar38._4_4_ * fVar216;
  auVar218._8_4_ = auVar38._8_4_ * fVar201;
  auVar218._12_4_ = auVar38._12_4_ * fVar212;
  auVar37 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar37);
  auVar45 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar168);
  local_510 = vsubps_avx512vl(_local_550,auVar10);
  uVar106 = local_510._0_4_;
  auVar100._4_4_ = uVar106;
  auVar100._0_4_ = uVar106;
  auVar100._8_4_ = uVar106;
  auVar100._12_4_ = uVar106;
  auVar37 = vshufps_avx(local_510,local_510,0x55);
  auVar38 = vshufps_avx(local_510,local_510,0xaa);
  auVar157._0_4_ = auVar38._0_4_ * fVar99;
  auVar157._4_4_ = auVar38._4_4_ * fVar216;
  auVar157._8_4_ = auVar38._8_4_ * fVar201;
  auVar157._12_4_ = auVar38._12_4_ * fVar212;
  auVar37 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar2,auVar37);
  auVar10 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar100);
  auVar39 = vmovlhps_avx(auVar48,auVar42);
  auVar49 = vmovlhps_avx512f(auVar43,auVar44);
  auVar9 = vmovlhps_avx512f(auVar40,auVar45);
  _local_480 = vmovlhps_avx512f(auVar41,auVar10);
  auVar37 = vminps_avx512vl(auVar39,auVar49);
  auVar51 = vmaxps_avx512vl(auVar39,auVar49);
  auVar38 = vminps_avx512vl(auVar9,_local_480);
  auVar38 = vminps_avx(auVar37,auVar38);
  auVar37 = vmaxps_avx512vl(auVar9,_local_480);
  auVar37 = vmaxps_avx(auVar51,auVar37);
  auVar51 = vshufpd_avx(auVar38,auVar38,3);
  auVar50 = vshufpd_avx(auVar37,auVar37,3);
  auVar38 = vminps_avx(auVar38,auVar51);
  auVar37 = vmaxps_avx(auVar37,auVar50);
  auVar38 = vandps_avx512vl(auVar38,auVar245._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar245._0_16_);
  auVar37 = vmaxps_avx(auVar38,auVar37);
  auVar38 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar38,auVar37);
  auVar169._8_8_ = auVar48._0_8_;
  auVar169._0_8_ = auVar48._0_8_;
  auVar38 = vmovddup_avx512vl(auVar43);
  auVar51 = vmovddup_avx512vl(auVar40);
  auVar186._0_8_ = auVar41._0_8_;
  auVar186._8_8_ = auVar186._0_8_;
  local_490 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
  local_440 = vbroadcastss_avx512vl(local_490);
  auVar37 = vxorps_avx512vl(local_440._0_16_,auVar54);
  local_3c0 = auVar37._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  auVar85 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar85);
  bVar31 = false;
  uVar23 = 0;
  fVar99 = *(float *)(ray + k * 4 + 0xc0);
  local_450 = vsubps_avx512vl(auVar49,auVar39);
  local_460 = vsubps_avx512vl(auVar9,auVar49);
  local_470 = vsubps_avx512vl(_local_480,auVar9);
  local_5b0 = vsubps_avx(_local_530,local_520);
  local_5c0 = vsubps_avx512vl(_local_580,local_560);
  local_5d0 = vsubps_avx512vl(_local_590,local_570);
  _local_5e0 = vsubps_avx512vl(_local_550,local_540);
  auVar85 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar85);
  auVar37 = ZEXT816(0x3f80000000000000);
  auVar111 = auVar37;
LAB_0181b6c8:
  auVar247 = ZEXT3264(local_440);
  auVar50 = vshufps_avx(auVar111,auVar111,0x50);
  auVar234._8_4_ = 0x3f800000;
  auVar234._0_8_ = 0x3f8000003f800000;
  auVar234._12_4_ = 0x3f800000;
  auVar84._16_4_ = 0x3f800000;
  auVar84._0_16_ = auVar234;
  auVar84._20_4_ = 0x3f800000;
  auVar84._24_4_ = 0x3f800000;
  auVar84._28_4_ = 0x3f800000;
  auVar48 = vsubps_avx(auVar234,auVar50);
  fVar216 = auVar50._0_4_;
  fVar122 = auVar42._0_4_;
  auVar135._0_4_ = fVar122 * fVar216;
  fVar201 = auVar50._4_4_;
  fVar123 = auVar42._4_4_;
  auVar135._4_4_ = fVar123 * fVar201;
  fVar212 = auVar50._8_4_;
  auVar135._8_4_ = fVar122 * fVar212;
  fVar214 = auVar50._12_4_;
  auVar135._12_4_ = fVar123 * fVar214;
  fVar124 = auVar44._0_4_;
  auVar144._0_4_ = fVar124 * fVar216;
  fVar134 = auVar44._4_4_;
  auVar144._4_4_ = fVar134 * fVar201;
  auVar144._8_4_ = fVar124 * fVar212;
  auVar144._12_4_ = fVar134 * fVar214;
  fVar139 = auVar45._0_4_;
  auVar158._0_4_ = fVar139 * fVar216;
  fVar140 = auVar45._4_4_;
  auVar158._4_4_ = fVar140 * fVar201;
  auVar158._8_4_ = fVar139 * fVar212;
  auVar158._12_4_ = fVar140 * fVar214;
  fVar141 = auVar10._0_4_;
  auVar117._0_4_ = fVar141 * fVar216;
  fVar200 = auVar10._4_4_;
  auVar117._4_4_ = fVar200 * fVar201;
  auVar117._8_4_ = fVar141 * fVar212;
  auVar117._12_4_ = fVar200 * fVar214;
  auVar43 = vfmadd231ps_fma(auVar135,auVar48,auVar169);
  auVar40 = vfmadd231ps_avx512vl(auVar144,auVar48,auVar38);
  auVar41 = vfmadd231ps_avx512vl(auVar158,auVar48,auVar51);
  auVar48 = vfmadd231ps_fma(auVar117,auVar186,auVar48);
  auVar50 = vmovshdup_avx(auVar37);
  fVar201 = auVar37._0_4_;
  fVar216 = (auVar50._0_4_ - fVar201) * 0.04761905;
  auVar78._4_4_ = fVar201;
  auVar78._0_4_ = fVar201;
  auVar78._8_4_ = fVar201;
  auVar78._12_4_ = fVar201;
  auVar78._16_4_ = fVar201;
  auVar78._20_4_ = fVar201;
  auVar78._24_4_ = fVar201;
  auVar78._28_4_ = fVar201;
  auVar68._0_8_ = auVar50._0_8_;
  auVar68._8_8_ = auVar68._0_8_;
  auVar68._16_8_ = auVar68._0_8_;
  auVar68._24_8_ = auVar68._0_8_;
  auVar81 = vsubps_avx(auVar68,auVar78);
  uVar106 = auVar43._0_4_;
  auVar82._4_4_ = uVar106;
  auVar82._0_4_ = uVar106;
  auVar82._8_4_ = uVar106;
  auVar82._12_4_ = uVar106;
  auVar82._16_4_ = uVar106;
  auVar82._20_4_ = uVar106;
  auVar82._24_4_ = uVar106;
  auVar82._28_4_ = uVar106;
  auVar70._8_4_ = 1;
  auVar70._0_8_ = 0x100000001;
  auVar70._12_4_ = 1;
  auVar70._16_4_ = 1;
  auVar70._20_4_ = 1;
  auVar70._24_4_ = 1;
  auVar70._28_4_ = 1;
  auVar80 = ZEXT1632(auVar43);
  auVar79 = vpermps_avx2(auVar70,auVar80);
  auVar64 = vbroadcastss_avx512vl(auVar40);
  auVar74 = ZEXT1632(auVar40);
  auVar65 = vpermps_avx512vl(auVar70,auVar74);
  auVar66 = vbroadcastss_avx512vl(auVar41);
  auVar75 = ZEXT1632(auVar41);
  auVar67 = vpermps_avx512vl(auVar70,auVar75);
  auVar68 = vbroadcastss_avx512vl(auVar48);
  auVar77 = ZEXT1632(auVar48);
  auVar69 = vpermps_avx512vl(auVar70,auVar77);
  auVar83._4_4_ = fVar216;
  auVar83._0_4_ = fVar216;
  auVar83._8_4_ = fVar216;
  auVar83._12_4_ = fVar216;
  auVar83._16_4_ = fVar216;
  auVar83._20_4_ = fVar216;
  auVar83._24_4_ = fVar216;
  auVar83._28_4_ = fVar216;
  auVar76._8_4_ = 2;
  auVar76._0_8_ = 0x200000002;
  auVar76._12_4_ = 2;
  auVar76._16_4_ = 2;
  auVar76._20_4_ = 2;
  auVar76._24_4_ = 2;
  auVar76._28_4_ = 2;
  auVar70 = vpermps_avx512vl(auVar76,auVar80);
  auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar72 = vpermps_avx512vl(auVar71,auVar80);
  auVar73 = vpermps_avx512vl(auVar76,auVar74);
  auVar74 = vpermps_avx512vl(auVar71,auVar74);
  auVar80 = vpermps_avx2(auVar76,auVar75);
  auVar75 = vpermps_avx512vl(auVar71,auVar75);
  auVar76 = vpermps_avx512vl(auVar76,auVar77);
  auVar71 = vpermps_avx512vl(auVar71,auVar77);
  auVar50 = vfmadd132ps_fma(auVar81,auVar78,_DAT_01f7b040);
  auVar81 = vsubps_avx(auVar84,ZEXT1632(auVar50));
  auVar77 = vmulps_avx512vl(auVar64,ZEXT1632(auVar50));
  auVar84 = ZEXT1632(auVar50);
  auVar78 = vmulps_avx512vl(auVar65,auVar84);
  auVar48 = vfmadd231ps_fma(auVar77,auVar81,auVar82);
  auVar43 = vfmadd231ps_fma(auVar78,auVar81,auVar79);
  auVar77 = vmulps_avx512vl(auVar66,auVar84);
  auVar78 = vmulps_avx512vl(auVar67,auVar84);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar64);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar65);
  auVar64 = vmulps_avx512vl(auVar68,auVar84);
  auVar82 = ZEXT1632(auVar50);
  auVar65 = vmulps_avx512vl(auVar69,auVar82);
  auVar66 = vfmadd231ps_avx512vl(auVar64,auVar81,auVar66);
  auVar67 = vfmadd231ps_avx512vl(auVar65,auVar81,auVar67);
  fVar212 = auVar50._0_4_;
  fVar214 = auVar50._4_4_;
  auVar64._4_4_ = fVar214 * auVar77._4_4_;
  auVar64._0_4_ = fVar212 * auVar77._0_4_;
  fVar211 = auVar50._8_4_;
  auVar64._8_4_ = fVar211 * auVar77._8_4_;
  fVar213 = auVar50._12_4_;
  auVar64._12_4_ = fVar213 * auVar77._12_4_;
  auVar64._16_4_ = auVar77._16_4_ * 0.0;
  auVar64._20_4_ = auVar77._20_4_ * 0.0;
  auVar64._24_4_ = auVar77._24_4_ * 0.0;
  auVar64._28_4_ = fVar201;
  auVar65._4_4_ = fVar214 * auVar78._4_4_;
  auVar65._0_4_ = fVar212 * auVar78._0_4_;
  auVar65._8_4_ = fVar211 * auVar78._8_4_;
  auVar65._12_4_ = fVar213 * auVar78._12_4_;
  auVar65._16_4_ = auVar78._16_4_ * 0.0;
  auVar65._20_4_ = auVar78._20_4_ * 0.0;
  auVar65._24_4_ = auVar78._24_4_ * 0.0;
  auVar65._28_4_ = auVar79._28_4_;
  auVar48 = vfmadd231ps_fma(auVar64,auVar81,ZEXT1632(auVar48));
  auVar43 = vfmadd231ps_fma(auVar65,auVar81,ZEXT1632(auVar43));
  auVar69._0_4_ = fVar212 * auVar66._0_4_;
  auVar69._4_4_ = fVar214 * auVar66._4_4_;
  auVar69._8_4_ = fVar211 * auVar66._8_4_;
  auVar69._12_4_ = fVar213 * auVar66._12_4_;
  auVar69._16_4_ = auVar66._16_4_ * 0.0;
  auVar69._20_4_ = auVar66._20_4_ * 0.0;
  auVar69._24_4_ = auVar66._24_4_ * 0.0;
  auVar69._28_4_ = 0;
  auVar79._4_4_ = fVar214 * auVar67._4_4_;
  auVar79._0_4_ = fVar212 * auVar67._0_4_;
  auVar79._8_4_ = fVar211 * auVar67._8_4_;
  auVar79._12_4_ = fVar213 * auVar67._12_4_;
  auVar79._16_4_ = auVar67._16_4_ * 0.0;
  auVar79._20_4_ = auVar67._20_4_ * 0.0;
  auVar79._24_4_ = auVar67._24_4_ * 0.0;
  auVar79._28_4_ = auVar66._28_4_;
  auVar40 = vfmadd231ps_fma(auVar69,auVar81,auVar77);
  auVar41 = vfmadd231ps_fma(auVar79,auVar81,auVar78);
  auVar66._28_4_ = auVar78._28_4_;
  auVar66._0_28_ =
       ZEXT1628(CONCAT412(fVar213 * auVar41._12_4_,
                          CONCAT48(fVar211 * auVar41._8_4_,
                                   CONCAT44(fVar214 * auVar41._4_4_,fVar212 * auVar41._0_4_))));
  auVar46 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar213 * auVar40._12_4_,
                                               CONCAT48(fVar211 * auVar40._8_4_,
                                                        CONCAT44(fVar214 * auVar40._4_4_,
                                                                 fVar212 * auVar40._0_4_)))),auVar81
                            ,ZEXT1632(auVar48));
  auVar47 = vfmadd231ps_fma(auVar66,auVar81,ZEXT1632(auVar43));
  auVar79 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar48));
  auVar64 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar43));
  auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar79 = vmulps_avx512vl(auVar79,auVar65);
  auVar64 = vmulps_avx512vl(auVar64,auVar65);
  auVar77._0_4_ = fVar216 * auVar79._0_4_;
  auVar77._4_4_ = fVar216 * auVar79._4_4_;
  auVar77._8_4_ = fVar216 * auVar79._8_4_;
  auVar77._12_4_ = fVar216 * auVar79._12_4_;
  auVar77._16_4_ = fVar216 * auVar79._16_4_;
  auVar77._20_4_ = fVar216 * auVar79._20_4_;
  auVar77._24_4_ = fVar216 * auVar79._24_4_;
  auVar77._28_4_ = 0;
  auVar79 = vmulps_avx512vl(auVar83,auVar64);
  auVar43 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
  auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar46),_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar121._0_4_ = auVar77._0_4_ + auVar46._0_4_;
  auVar121._4_4_ = auVar77._4_4_ + auVar46._4_4_;
  auVar121._8_4_ = auVar77._8_4_ + auVar46._8_4_;
  auVar121._12_4_ = auVar77._12_4_ + auVar46._12_4_;
  auVar121._16_4_ = auVar77._16_4_ + 0.0;
  auVar121._20_4_ = auVar77._20_4_ + 0.0;
  auVar121._24_4_ = auVar77._24_4_ + 0.0;
  auVar121._28_4_ = 0;
  auVar78 = ZEXT1632(auVar43);
  auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01fb9fc0,auVar78);
  auVar68 = vaddps_avx512vl(ZEXT1632(auVar47),auVar79);
  auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar78);
  auVar79 = vsubps_avx(auVar64,auVar67);
  auVar69 = vsubps_avx512vl(auVar66,auVar69);
  auVar67 = vmulps_avx512vl(auVar73,auVar82);
  auVar77 = vmulps_avx512vl(auVar74,auVar82);
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar70);
  auVar70 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar72);
  auVar72 = vmulps_avx512vl(auVar80,auVar82);
  auVar77 = vmulps_avx512vl(auVar75,auVar82);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar81,auVar73);
  auVar73 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar74);
  auVar74 = vmulps_avx512vl(auVar76,auVar82);
  auVar71 = vmulps_avx512vl(auVar71,auVar82);
  auVar48 = vfmadd231ps_fma(auVar74,auVar81,auVar80);
  auVar80 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar75);
  auVar71 = vmulps_avx512vl(auVar82,auVar72);
  auVar76 = ZEXT1632(auVar50);
  auVar74 = vmulps_avx512vl(auVar76,auVar73);
  auVar67 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar67);
  auVar70 = vfmadd231ps_avx512vl(auVar74,auVar81,auVar70);
  auVar80 = vmulps_avx512vl(auVar76,auVar80);
  auVar71 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar213 * auVar48._12_4_,
                                          CONCAT48(fVar211 * auVar48._8_4_,
                                                   CONCAT44(fVar214 * auVar48._4_4_,
                                                            fVar212 * auVar48._0_4_)))),auVar81,
                       auVar72);
  auVar72 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar73);
  auVar80._4_4_ = fVar214 * auVar71._4_4_;
  auVar80._0_4_ = fVar212 * auVar71._0_4_;
  auVar80._8_4_ = fVar211 * auVar71._8_4_;
  auVar80._12_4_ = fVar213 * auVar71._12_4_;
  auVar80._16_4_ = auVar71._16_4_ * 0.0;
  auVar80._20_4_ = auVar71._20_4_ * 0.0;
  auVar80._24_4_ = auVar71._24_4_ * 0.0;
  auVar80._28_4_ = auVar75._28_4_;
  auVar73 = vmulps_avx512vl(auVar76,auVar72);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar67);
  auVar73 = vfmadd231ps_avx512vl(auVar73,auVar70,auVar81);
  auVar81 = vsubps_avx512vl(auVar71,auVar67);
  auVar67 = vsubps_avx512vl(auVar72,auVar70);
  auVar70 = vmulps_avx512vl(auVar81,auVar65);
  auVar65 = vmulps_avx512vl(auVar67,auVar65);
  fVar201 = fVar216 * auVar70._0_4_;
  fVar212 = fVar216 * auVar70._4_4_;
  auVar81._4_4_ = fVar212;
  auVar81._0_4_ = fVar201;
  fVar214 = fVar216 * auVar70._8_4_;
  auVar81._8_4_ = fVar214;
  fVar211 = fVar216 * auVar70._12_4_;
  auVar81._12_4_ = fVar211;
  fVar213 = fVar216 * auVar70._16_4_;
  auVar81._16_4_ = fVar213;
  fVar215 = fVar216 * auVar70._20_4_;
  auVar81._20_4_ = fVar215;
  fVar216 = fVar216 * auVar70._24_4_;
  auVar81._24_4_ = fVar216;
  auVar81._28_4_ = auVar70._28_4_;
  auVar65 = vmulps_avx512vl(auVar83,auVar65);
  auVar71 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,auVar78);
  auVar72 = vpermt2ps_avx512vl(auVar73,_DAT_01fb9fc0,auVar78);
  auVar199._0_4_ = auVar80._0_4_ + fVar201;
  auVar199._4_4_ = auVar80._4_4_ + fVar212;
  auVar199._8_4_ = auVar80._8_4_ + fVar214;
  auVar199._12_4_ = auVar80._12_4_ + fVar211;
  auVar199._16_4_ = auVar80._16_4_ + fVar213;
  auVar199._20_4_ = auVar80._20_4_ + fVar215;
  auVar199._24_4_ = auVar80._24_4_ + fVar216;
  auVar199._28_4_ = auVar80._28_4_ + auVar70._28_4_;
  auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar70 = vaddps_avx512vl(auVar73,auVar65);
  auVar65 = vpermt2ps_avx512vl(auVar65,_DAT_01fb9fc0,ZEXT1632(auVar43));
  auVar81 = vsubps_avx(auVar71,auVar81);
  auVar65 = vsubps_avx512vl(auVar72,auVar65);
  auVar138 = ZEXT1632(auVar46);
  auVar67 = vsubps_avx512vl(auVar80,auVar138);
  auVar151 = ZEXT1632(auVar47);
  auVar74 = vsubps_avx512vl(auVar73,auVar151);
  auVar75 = vsubps_avx512vl(auVar71,auVar64);
  auVar67 = vaddps_avx512vl(auVar67,auVar75);
  auVar75 = vsubps_avx512vl(auVar72,auVar66);
  auVar74 = vaddps_avx512vl(auVar74,auVar75);
  auVar75 = vmulps_avx512vl(auVar151,auVar67);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar138,auVar74);
  auVar76 = vmulps_avx512vl(auVar68,auVar67);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar121,auVar74);
  auVar77 = vmulps_avx512vl(auVar69,auVar67);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar79,auVar74);
  auVar78 = vmulps_avx512vl(auVar66,auVar67);
  auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar64,auVar74);
  auVar82 = vmulps_avx512vl(auVar73,auVar67);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar74);
  auVar83 = vmulps_avx512vl(auVar70,auVar67);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar199,auVar74);
  auVar84 = vmulps_avx512vl(auVar65,auVar67);
  auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar81,auVar74);
  auVar67 = vmulps_avx512vl(auVar72,auVar67);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar71,auVar74);
  auVar74 = vminps_avx512vl(auVar75,auVar76);
  auVar75 = vmaxps_avx512vl(auVar75,auVar76);
  auVar76 = vminps_avx512vl(auVar77,auVar78);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar76 = vmaxps_avx512vl(auVar77,auVar78);
  auVar75 = vmaxps_avx512vl(auVar75,auVar76);
  auVar76 = vminps_avx512vl(auVar82,auVar83);
  auVar77 = vmaxps_avx512vl(auVar82,auVar83);
  auVar78 = vminps_avx512vl(auVar84,auVar67);
  auVar76 = vminps_avx512vl(auVar76,auVar78);
  auVar74 = vminps_avx512vl(auVar74,auVar76);
  auVar67 = vmaxps_avx512vl(auVar84,auVar67);
  auVar67 = vmaxps_avx512vl(auVar77,auVar67);
  auVar75 = vmaxps_avx512vl(auVar75,auVar67);
  auVar241 = ZEXT3264(auVar75);
  uVar11 = vcmpps_avx512vl(auVar74,local_440,2);
  auVar67._4_4_ = uStack_3bc;
  auVar67._0_4_ = local_3c0;
  auVar67._8_4_ = uStack_3b8;
  auVar67._12_4_ = uStack_3b4;
  auVar67._16_4_ = uStack_3b0;
  auVar67._20_4_ = uStack_3ac;
  auVar67._24_4_ = uStack_3a8;
  auVar67._28_4_ = uStack_3a4;
  uVar12 = vcmpps_avx512vl(auVar75,auVar67,5);
  bVar21 = (byte)uVar11 & (byte)uVar12 & 0x7f;
  if (bVar21 == 0) {
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar242 = ZEXT3264(auVar81);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar243 = ZEXT1664(auVar37);
    auVar86._32_32_ = auVar85._32_32_;
    auVar86._0_32_ = _DAT_01fb9fe0;
    auVar244 = ZEXT3264(_DAT_01fb9fe0);
  }
  else {
    auVar74 = vsubps_avx512vl(auVar64,auVar138);
    auVar75 = vsubps_avx512vl(auVar66,auVar151);
    auVar76 = vsubps_avx512vl(auVar71,auVar80);
    auVar74 = vaddps_avx512vl(auVar74,auVar76);
    auVar241 = ZEXT3264(auVar74);
    auVar76 = vsubps_avx512vl(auVar72,auVar73);
    auVar75 = vaddps_avx512vl(auVar75,auVar76);
    auVar76 = vmulps_avx512vl(auVar151,auVar74);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar75,auVar138);
    auVar68 = vmulps_avx512vl(auVar68,auVar74);
    auVar68 = vfnmadd213ps_avx512vl(auVar121,auVar75,auVar68);
    auVar69 = vmulps_avx512vl(auVar69,auVar74);
    auVar69 = vfnmadd213ps_avx512vl(auVar79,auVar75,auVar69);
    auVar79 = vmulps_avx512vl(auVar66,auVar74);
    auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar64);
    auVar79 = vmulps_avx512vl(auVar73,auVar74);
    auVar73 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar80);
    auVar79 = vmulps_avx512vl(auVar70,auVar74);
    auVar70 = vfnmadd213ps_avx512vl(auVar199,auVar75,auVar79);
    auVar79 = vmulps_avx512vl(auVar65,auVar74);
    auVar77 = vfnmadd213ps_avx512vl(auVar81,auVar75,auVar79);
    auVar81 = vmulps_avx512vl(auVar72,auVar74);
    auVar71 = vfnmadd231ps_avx512vl(auVar81,auVar71,auVar75);
    auVar79 = vminps_avx(auVar76,auVar68);
    auVar81 = vmaxps_avx(auVar76,auVar68);
    auVar64 = vminps_avx(auVar69,auVar66);
    auVar64 = vminps_avx(auVar79,auVar64);
    auVar79 = vmaxps_avx(auVar69,auVar66);
    auVar81 = vmaxps_avx(auVar81,auVar79);
    auVar80 = vminps_avx(auVar73,auVar70);
    auVar79 = vmaxps_avx(auVar73,auVar70);
    auVar65 = vminps_avx(auVar77,auVar71);
    auVar80 = vminps_avx(auVar80,auVar65);
    auVar80 = vminps_avx(auVar64,auVar80);
    auVar64 = vmaxps_avx(auVar77,auVar71);
    auVar79 = vmaxps_avx(auVar79,auVar64);
    auVar81 = vmaxps_avx(auVar81,auVar79);
    uVar11 = vcmpps_avx512vl(auVar81,auVar67,5);
    uVar12 = vcmpps_avx512vl(auVar80,local_440,2);
    bVar21 = bVar21 & (byte)uVar11 & (byte)uVar12;
    if (bVar21 != 0) {
      auStack_620[uVar23] = (uint)bVar21;
      uVar11 = vmovlps_avx(auVar37);
      (&uStack_420)[uVar23] = uVar11;
      uVar28 = vmovlps_avx(auVar111);
      auStack_3a0[uVar23] = uVar28;
      uVar23 = (ulong)((int)uVar23 + 1);
    }
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar242 = ZEXT3264(auVar81);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar243 = ZEXT1664(auVar37);
    auVar86._32_32_ = auVar85._32_32_;
    auVar86._0_32_ = _DAT_01fb9fe0;
    auVar244 = ZEXT3264(_DAT_01fb9fe0);
  }
LAB_0181bc0e:
  do {
    do {
      do {
        auVar50 = SUB6416(ZEXT464(0xb8d1b717),0);
        auVar48 = auVar246._0_16_;
        if ((int)uVar23 == 0) {
          if (bVar31) goto LAB_0181cb69;
          uVar106 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar19._4_4_ = uVar106;
          auVar19._0_4_ = uVar106;
          auVar19._8_4_ = uVar106;
          auVar19._12_4_ = uVar106;
          uVar11 = vcmpps_avx512vl(local_5a0,auVar19,2);
          uVar29 = (ulong)((uint)uVar30 & (uint)uVar11);
          goto LAB_0181af50;
        }
        uVar22 = (int)uVar23 - 1;
        uVar24 = (ulong)uVar22;
        uVar4 = auStack_620[uVar24];
        auVar111._8_8_ = 0;
        auVar111._0_8_ = auStack_3a0[uVar24];
        uVar28 = 0;
        for (uVar27 = (ulong)uVar4; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          uVar28 = uVar28 + 1;
        }
        uVar26 = uVar4 - 1 & uVar4;
        bVar34 = uVar26 == 0;
        auStack_620[uVar24] = uVar26;
        if (bVar34) {
          uVar23 = (ulong)uVar22;
        }
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar28;
        auVar37 = vpunpcklqdq_avx(auVar101,ZEXT416((int)uVar28 + 1));
        auVar85._32_32_ = auVar86._32_32_;
        auVar37 = vcvtqq2ps_avx512vl(auVar37);
        auVar37 = vmulps_avx512vl(auVar37,auVar243._0_16_);
        uVar106 = *(undefined4 *)((long)&uStack_420 + uVar24 * 8 + 4);
        auVar13._4_4_ = uVar106;
        auVar13._0_4_ = uVar106;
        auVar13._8_4_ = uVar106;
        auVar13._12_4_ = uVar106;
        auVar43 = vmulps_avx512vl(auVar37,auVar13);
        auVar37 = vsubps_avx512vl(auVar48,auVar37);
        uVar106 = *(undefined4 *)(&uStack_420 + uVar24);
        auVar14._4_4_ = uVar106;
        auVar14._0_4_ = uVar106;
        auVar14._8_4_ = uVar106;
        auVar14._12_4_ = uVar106;
        auVar37 = vfmadd231ps_avx512vl(auVar43,auVar37,auVar14);
        auVar43 = vmovshdup_avx(auVar37);
        fVar216 = auVar43._0_4_ - auVar37._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar216));
        if (uVar4 == 0 || bVar34) goto LAB_0181b6c8;
        auVar43 = vshufps_avx(auVar111,auVar111,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar216));
        bVar32 = (uint)uVar23 < 4;
        uVar22 = (uint)uVar23 - 4;
        bVar35 = uVar22 == 0;
        bVar33 = (POPCOUNT(uVar22 & 0xff) & 1U) == 0;
        auVar46 = vsubps_avx512vl(auVar48,auVar43);
        fVar201 = auVar43._0_4_;
        auVar145._0_4_ = fVar201 * fVar122;
        fVar212 = auVar43._4_4_;
        auVar145._4_4_ = fVar212 * fVar123;
        fVar214 = auVar43._8_4_;
        auVar145._8_4_ = fVar214 * fVar122;
        fVar211 = auVar43._12_4_;
        auVar145._12_4_ = fVar211 * fVar123;
        auVar159._0_4_ = fVar201 * fVar124;
        auVar159._4_4_ = fVar212 * fVar134;
        auVar159._8_4_ = fVar214 * fVar124;
        auVar159._12_4_ = fVar211 * fVar134;
        auVar170._0_4_ = fVar201 * fVar139;
        auVar170._4_4_ = fVar212 * fVar140;
        auVar170._8_4_ = fVar214 * fVar139;
        auVar170._12_4_ = fVar211 * fVar140;
        auVar130._0_4_ = fVar201 * fVar141;
        auVar130._4_4_ = fVar212 * fVar200;
        auVar130._8_4_ = fVar214 * fVar141;
        auVar130._12_4_ = fVar211 * fVar200;
        auVar43 = vfmadd231ps_fma(auVar145,auVar46,auVar169);
        auVar40 = vfmadd231ps_fma(auVar159,auVar46,auVar38);
        auVar41 = vfmadd231ps_fma(auVar170,auVar46,auVar51);
        auVar46 = vfmadd231ps_fma(auVar130,auVar46,auVar186);
        auVar71._16_16_ = auVar43;
        auVar71._0_16_ = auVar43;
        auVar72._16_16_ = auVar40;
        auVar72._0_16_ = auVar40;
        auVar74._16_16_ = auVar41;
        auVar74._0_16_ = auVar41;
        auVar79 = vpermps_avx512vl(auVar244._0_32_,ZEXT1632(auVar37));
        auVar81 = vsubps_avx(auVar72,auVar71);
        auVar40 = vfmadd213ps_fma(auVar81,auVar79,auVar71);
        auVar81 = vsubps_avx(auVar74,auVar72);
        auVar47 = vfmadd213ps_fma(auVar81,auVar79,auVar72);
        auVar43 = vsubps_avx(auVar46,auVar41);
        auVar73._16_16_ = auVar43;
        auVar73._0_16_ = auVar43;
        auVar43 = vfmadd213ps_fma(auVar73,auVar79,auVar74);
        auVar81 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar40));
        auVar40 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar40));
        auVar81 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar47));
        auVar43 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar47));
        auVar81 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar40));
        auVar62 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar81,auVar79);
        auVar85._0_32_ = vmulps_avx512vl(auVar81,auVar242._0_32_);
        auVar86._16_48_ = auVar85._16_48_;
        auVar43 = vmulss_avx512f(ZEXT416((uint)fVar216),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar201 = auVar43._0_4_;
        auVar171._0_8_ =
             CONCAT44(auVar62._4_4_ + fVar201 * auVar85._4_4_,
                      auVar62._0_4_ + fVar201 * auVar85._0_4_);
        auVar171._8_4_ = auVar62._8_4_ + fVar201 * auVar85._8_4_;
        auVar171._12_4_ = auVar62._12_4_ + fVar201 * auVar85._12_4_;
        auVar146._0_4_ = fVar201 * auVar85._16_4_;
        auVar146._4_4_ = fVar201 * auVar85._20_4_;
        auVar146._8_4_ = fVar201 * auVar85._24_4_;
        auVar146._12_4_ = fVar201 * auVar85._28_4_;
        auVar57 = vsubps_avx((undefined1  [16])0x0,auVar146);
        auVar47 = vshufpd_avx(auVar62,auVar62,3);
        auVar63 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar43 = vsubps_avx(auVar47,auVar62);
        auVar40 = vsubps_avx(auVar63,(undefined1  [16])0x0);
        auVar187._0_4_ = auVar43._0_4_ + auVar40._0_4_;
        auVar187._4_4_ = auVar43._4_4_ + auVar40._4_4_;
        auVar187._8_4_ = auVar43._8_4_ + auVar40._8_4_;
        auVar187._12_4_ = auVar43._12_4_ + auVar40._12_4_;
        auVar43 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar40 = vshufps_avx(auVar171,auVar171,0xb1);
        auVar41 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar46 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar235._4_4_ = auVar187._0_4_;
        auVar235._0_4_ = auVar187._0_4_;
        auVar235._8_4_ = auVar187._0_4_;
        auVar235._12_4_ = auVar187._0_4_;
        auVar54 = vshufps_avx(auVar187,auVar187,0x55);
        fVar201 = auVar54._0_4_;
        auVar197._0_4_ = auVar43._0_4_ * fVar201;
        fVar212 = auVar54._4_4_;
        auVar197._4_4_ = auVar43._4_4_ * fVar212;
        fVar214 = auVar54._8_4_;
        auVar197._8_4_ = auVar43._8_4_ * fVar214;
        fVar211 = auVar54._12_4_;
        auVar197._12_4_ = auVar43._12_4_ * fVar211;
        auVar203._0_4_ = auVar40._0_4_ * fVar201;
        auVar203._4_4_ = auVar40._4_4_ * fVar212;
        auVar203._8_4_ = auVar40._8_4_ * fVar214;
        auVar203._12_4_ = auVar40._12_4_ * fVar211;
        auVar219._0_4_ = auVar41._0_4_ * fVar201;
        auVar219._4_4_ = auVar41._4_4_ * fVar212;
        auVar219._8_4_ = auVar41._8_4_ * fVar214;
        auVar219._12_4_ = auVar41._12_4_ * fVar211;
        auVar188._0_4_ = auVar46._0_4_ * fVar201;
        auVar188._4_4_ = auVar46._4_4_ * fVar212;
        auVar188._8_4_ = auVar46._8_4_ * fVar214;
        auVar188._12_4_ = auVar46._12_4_ * fVar211;
        auVar43 = vfmadd231ps_fma(auVar197,auVar235,auVar62);
        auVar40 = vfmadd231ps_fma(auVar203,auVar235,auVar171);
        auVar56 = vfmadd231ps_fma(auVar219,auVar235,auVar57);
        auVar58 = vfmadd231ps_fma(auVar188,(undefined1  [16])0x0,auVar235);
        auVar54 = vshufpd_avx(auVar43,auVar43,1);
        auVar55 = vshufpd_avx(auVar40,auVar40,1);
        auVar52 = vshufpd_avx512vl(auVar56,auVar56,1);
        auVar53 = vshufpd_avx512vl(auVar58,auVar58,1);
        auVar41 = vminss_avx(auVar43,auVar40);
        auVar43 = vmaxss_avx(auVar40,auVar43);
        auVar46 = vminss_avx(auVar56,auVar58);
        auVar40 = vmaxss_avx(auVar58,auVar56);
        auVar41 = vminss_avx(auVar41,auVar46);
        auVar43 = vmaxss_avx(auVar40,auVar43);
        auVar46 = vminss_avx(auVar54,auVar55);
        auVar40 = vmaxss_avx(auVar55,auVar54);
        auVar54 = vminss_avx512f(auVar52,auVar53);
        auVar55 = vmaxss_avx512f(auVar53,auVar52);
        vmaxss_avx(auVar55,auVar40);
        auVar86._0_16_ = vminss_avx512f(auVar46,auVar54);
        vucomiss_avx512f(auVar41);
        if ((!bVar32 && !bVar35) &&
           (auVar40 = vucomiss_avx512f(auVar50), bVar36 = bVar35, !bVar32 && !bVar35)) break;
        auVar40 = vucomiss_avx512f(auVar50);
        auVar46 = vucomiss_avx512f(auVar86._0_16_);
        auVar43 = vucomiss_avx512f(auVar50);
        bVar36 = bVar32 || bVar35;
        bVar33 = bVar32 || bVar35;
        if (!bVar32 && !bVar35) break;
        uVar11 = vcmpps_avx512vl(auVar41,auVar46,5);
        uVar12 = vcmpps_avx512vl(auVar86._0_16_,auVar46,5);
        bVar21 = (byte)uVar11 & (byte)uVar12;
        bVar20 = (bVar21 & 1) == 0;
        bVar36 = (!bVar32 && !bVar35) && bVar20;
        bVar33 = (!bVar32 && !bVar35) && (bVar21 & 1) == 0;
      } while ((bVar32 || bVar35) || !bVar20);
      auVar54 = vxorps_avx512vl(auVar247._0_16_,auVar247._0_16_);
      auVar247 = ZEXT1664(auVar54);
      vcmpss_avx512f(auVar41,auVar54,1);
      uVar11 = vcmpss_avx512f(auVar43,auVar54,1);
      bVar35 = (bool)((byte)uVar11 & 1);
      auVar88._16_48_ = auVar86._16_48_;
      auVar88._0_16_ = auVar105._0_16_;
      auVar87._4_60_ = auVar88._4_60_;
      auVar87._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar105._0_4_);
      vucomiss_avx512f(auVar87._0_16_);
      bVar33 = (bool)(!bVar36 | bVar33);
      bVar36 = bVar33 == false;
      auVar90._16_48_ = auVar86._16_48_;
      auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar89._4_60_ = auVar90._4_60_;
      auVar89._0_4_ = (uint)bVar33 * auVar54._0_4_ + (uint)!bVar33 * 0x7f800000;
      auVar46 = auVar89._0_16_;
      auVar92._16_48_ = auVar86._16_48_;
      auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar91._4_60_ = auVar92._4_60_;
      auVar91._0_4_ = (uint)bVar33 * auVar54._0_4_ + (uint)!bVar33 * -0x800000;
      auVar50 = auVar91._0_16_;
      auVar55 = vxorps_avx512vl(auVar241._0_16_,auVar241._0_16_);
      auVar241 = ZEXT1664(auVar55);
      uVar11 = vcmpss_avx512f(auVar86._0_16_,auVar54,1);
      bVar35 = (bool)((byte)uVar11 & 1);
      auVar94._16_48_ = auVar86._16_48_;
      auVar94._0_16_ = auVar105._0_16_;
      auVar93._4_60_ = auVar94._4_60_;
      auVar93._0_4_ = (float)((uint)bVar35 * -0x40800000 + (uint)!bVar35 * auVar105._0_4_);
      vucomiss_avx512f(auVar93._0_16_);
      if ((bVar33) || (bVar36)) {
        auVar54 = vucomiss_avx512f(auVar41);
        if ((bVar33) || (bVar36)) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar56 = vxorps_avx512vl(auVar41,auVar18);
          auVar41 = vsubss_avx512f(auVar54,auVar41);
          auVar41 = vdivss_avx512f(auVar56,auVar41);
          auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar41);
          auVar54 = vfmadd213ss_avx512f(auVar54,auVar55,auVar41);
          auVar41 = auVar54;
        }
        else {
          auVar41 = vxorps_avx512vl(auVar54,auVar54);
          vucomiss_avx512f(auVar41);
          auVar54 = ZEXT416(0x3f800000);
          if ((bVar33) || (bVar36)) {
            auVar54 = SUB6416(ZEXT464(0xff800000),0);
            auVar41 = ZEXT416(0x7f800000);
          }
        }
        auVar46 = vminss_avx512f(auVar46,auVar41);
        auVar50 = vmaxss_avx(auVar54,auVar50);
      }
      auVar105 = ZEXT464(0x3f800000);
      uVar11 = vcmpss_avx512f(auVar40,auVar55,1);
      bVar33 = (bool)((byte)uVar11 & 1);
      auVar41 = auVar105._0_16_;
      fVar201 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
      if ((auVar87._0_4_ != fVar201) || (NAN(auVar87._0_4_) || NAN(fVar201))) {
        fVar214 = auVar40._0_4_;
        fVar212 = auVar43._0_4_;
        if ((fVar214 != fVar212) || (NAN(fVar214) || NAN(fVar212))) {
          auVar17._8_4_ = 0x80000000;
          auVar17._0_8_ = 0x8000000080000000;
          auVar17._12_4_ = 0x80000000;
          auVar43 = vxorps_avx512vl(auVar43,auVar17);
          auVar189._0_4_ = auVar43._0_4_ / (fVar214 - fVar212);
          auVar189._4_12_ = auVar43._4_12_;
          auVar43 = vsubss_avx512f(auVar41,auVar189);
          auVar43 = vfmadd213ss_avx512f(auVar43,auVar55,auVar189);
          auVar40 = auVar43;
        }
        else if ((fVar212 != 0.0) || (auVar43 = auVar41, auVar40 = ZEXT816(0) << 0x40, NAN(fVar212))
                ) {
          auVar43 = SUB6416(ZEXT464(0xff800000),0);
          auVar40 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar46 = vminss_avx(auVar46,auVar40);
        auVar50 = vmaxss_avx(auVar43,auVar50);
      }
      bVar33 = auVar93._0_4_ != fVar201;
      auVar43 = vminss_avx512f(auVar46,auVar41);
      auVar96._16_48_ = auVar86._16_48_;
      auVar96._0_16_ = auVar46;
      auVar95._4_60_ = auVar96._4_60_;
      auVar95._0_4_ = (uint)bVar33 * auVar43._0_4_ + (uint)!bVar33 * auVar46._0_4_;
      auVar43 = vmaxss_avx512f(auVar41,auVar50);
      auVar98._16_48_ = auVar86._16_48_;
      auVar98._0_16_ = auVar50;
      auVar97._4_60_ = auVar98._4_60_;
      auVar97._0_4_ = (uint)bVar33 * auVar43._0_4_ + (uint)!bVar33 * auVar50._0_4_;
      auVar50 = vmaxss_avx512f(auVar55,auVar95._0_16_);
      auVar86._0_16_ = vminss_avx512f(auVar97._0_16_,auVar41);
    } while (auVar86._0_4_ < auVar50._0_4_);
    auVar46 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
    auVar56 = vminss_avx512f(ZEXT416((uint)(auVar86._0_4_ + 0.1)),auVar41);
    auVar131._0_8_ = auVar62._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar204._8_8_ = auVar171._0_8_;
    auVar204._0_8_ = auVar171._0_8_;
    auVar220._8_8_ = auVar57._0_8_;
    auVar220._0_8_ = auVar57._0_8_;
    auVar50 = vshufpd_avx(auVar171,auVar171,3);
    auVar43 = vshufpd_avx(auVar57,auVar57,3);
    auVar40 = vshufps_avx(auVar46,auVar56,0);
    auVar57 = vsubps_avx512vl(auVar48,auVar40);
    fVar201 = auVar40._0_4_;
    auVar160._0_4_ = fVar201 * auVar47._0_4_;
    fVar212 = auVar40._4_4_;
    auVar160._4_4_ = fVar212 * auVar47._4_4_;
    fVar214 = auVar40._8_4_;
    auVar160._8_4_ = fVar214 * auVar47._8_4_;
    fVar211 = auVar40._12_4_;
    auVar160._12_4_ = fVar211 * auVar47._12_4_;
    auVar172._0_4_ = fVar201 * auVar50._0_4_;
    auVar172._4_4_ = fVar212 * auVar50._4_4_;
    auVar172._8_4_ = fVar214 * auVar50._8_4_;
    auVar172._12_4_ = fVar211 * auVar50._12_4_;
    auVar237._0_4_ = auVar43._0_4_ * fVar201;
    auVar237._4_4_ = auVar43._4_4_ * fVar212;
    auVar237._8_4_ = auVar43._8_4_ * fVar214;
    auVar237._12_4_ = auVar43._12_4_ * fVar211;
    auVar147._0_4_ = fVar201 * auVar63._0_4_;
    auVar147._4_4_ = fVar212 * auVar63._4_4_;
    auVar147._8_4_ = fVar214 * auVar63._8_4_;
    auVar147._12_4_ = fVar211 * auVar63._12_4_;
    auVar47 = vfmadd231ps_fma(auVar160,auVar57,auVar131);
    auVar63 = vfmadd231ps_fma(auVar172,auVar57,auVar204);
    auVar54 = vfmadd231ps_fma(auVar237,auVar57,auVar220);
    auVar57 = vfmadd231ps_fma(auVar147,auVar57,ZEXT816(0));
    auVar43 = vsubss_avx512f(auVar41,auVar46);
    auVar50 = vmovshdup_avx(auVar111);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar46._0_4_)),auVar111,auVar43);
    auVar43 = vsubss_avx512f(auVar41,auVar56);
    auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar56._0_4_)),auVar111,auVar43);
    auVar56 = vdivss_avx512f(auVar41,ZEXT416((uint)fVar216));
    auVar50 = vsubps_avx(auVar63,auVar47);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar40 = vmulps_avx512vl(auVar50,auVar58);
    auVar50 = vsubps_avx(auVar54,auVar63);
    auVar46 = vmulps_avx512vl(auVar50,auVar58);
    auVar50 = vsubps_avx(auVar57,auVar54);
    auVar50 = vmulps_avx512vl(auVar50,auVar58);
    auVar43 = vminps_avx(auVar46,auVar50);
    auVar50 = vmaxps_avx(auVar46,auVar50);
    auVar43 = vminps_avx(auVar40,auVar43);
    auVar50 = vmaxps_avx(auVar40,auVar50);
    auVar40 = vshufpd_avx(auVar43,auVar43,3);
    auVar46 = vshufpd_avx(auVar50,auVar50,3);
    auVar43 = vminps_avx(auVar43,auVar40);
    auVar50 = vmaxps_avx(auVar50,auVar46);
    fVar216 = auVar56._0_4_;
    auVar190._0_4_ = auVar43._0_4_ * fVar216;
    auVar190._4_4_ = auVar43._4_4_ * fVar216;
    auVar190._8_4_ = auVar43._8_4_ * fVar216;
    auVar190._12_4_ = auVar43._12_4_ * fVar216;
    auVar178._0_4_ = fVar216 * auVar50._0_4_;
    auVar178._4_4_ = fVar216 * auVar50._4_4_;
    auVar178._8_4_ = fVar216 * auVar50._8_4_;
    auVar178._12_4_ = fVar216 * auVar50._12_4_;
    auVar56 = vdivss_avx512f(auVar41,ZEXT416((uint)(auVar53._0_4_ - auVar52._0_4_)));
    auVar50 = vshufpd_avx(auVar47,auVar47,3);
    auVar43 = vshufpd_avx(auVar63,auVar63,3);
    auVar40 = vshufpd_avx(auVar54,auVar54,3);
    auVar46 = vshufpd_avx(auVar57,auVar57,3);
    auVar50 = vsubps_avx(auVar50,auVar47);
    auVar47 = vsubps_avx(auVar43,auVar63);
    auVar63 = vsubps_avx(auVar40,auVar54);
    auVar46 = vsubps_avx(auVar46,auVar57);
    auVar43 = vminps_avx(auVar50,auVar47);
    auVar50 = vmaxps_avx(auVar50,auVar47);
    auVar40 = vminps_avx(auVar63,auVar46);
    auVar40 = vminps_avx(auVar43,auVar40);
    auVar43 = vmaxps_avx(auVar63,auVar46);
    auVar50 = vmaxps_avx(auVar50,auVar43);
    fVar216 = auVar56._0_4_;
    auVar221._0_4_ = fVar216 * auVar40._0_4_;
    auVar221._4_4_ = fVar216 * auVar40._4_4_;
    auVar221._8_4_ = fVar216 * auVar40._8_4_;
    auVar221._12_4_ = fVar216 * auVar40._12_4_;
    auVar205._0_4_ = fVar216 * auVar50._0_4_;
    auVar205._4_4_ = fVar216 * auVar50._4_4_;
    auVar205._8_4_ = fVar216 * auVar50._8_4_;
    auVar205._12_4_ = fVar216 * auVar50._12_4_;
    auVar46 = vinsertps_avx(auVar37,auVar52,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9f90,auVar53);
    auVar112._0_4_ = auVar46._0_4_ + auVar59._0_4_;
    auVar112._4_4_ = auVar46._4_4_ + auVar59._4_4_;
    auVar112._8_4_ = auVar46._8_4_ + auVar59._8_4_;
    auVar112._12_4_ = auVar46._12_4_ + auVar59._12_4_;
    auVar15._8_4_ = 0x3f000000;
    auVar15._0_8_ = 0x3f0000003f000000;
    auVar15._12_4_ = 0x3f000000;
    auVar56 = vmulps_avx512vl(auVar112,auVar15);
    auVar43 = vshufps_avx(auVar56,auVar56,0x54);
    uVar106 = auVar56._0_4_;
    auVar118._4_4_ = uVar106;
    auVar118._0_4_ = uVar106;
    auVar118._8_4_ = uVar106;
    auVar118._12_4_ = uVar106;
    auVar40 = vfmadd213ps_fma(local_450,auVar118,auVar39);
    auVar47 = vfmadd213ps_fma(local_460,auVar118,auVar49);
    auVar63 = vfmadd213ps_fma(local_470,auVar118,auVar9);
    auVar50 = vsubps_avx(auVar47,auVar40);
    auVar40 = vfmadd213ps_fma(auVar50,auVar118,auVar40);
    auVar50 = vsubps_avx(auVar63,auVar47);
    auVar50 = vfmadd213ps_fma(auVar50,auVar118,auVar47);
    auVar50 = vsubps_avx(auVar50,auVar40);
    auVar40 = vfmadd231ps_fma(auVar40,auVar50,auVar118);
    auVar54 = vmulps_avx512vl(auVar50,auVar58);
    auVar230._8_8_ = auVar40._0_8_;
    auVar230._0_8_ = auVar40._0_8_;
    auVar50 = vshufpd_avx(auVar40,auVar40,3);
    auVar40 = vshufps_avx(auVar56,auVar56,0x55);
    auVar47 = vsubps_avx(auVar50,auVar230);
    auVar63 = vfmadd231ps_fma(auVar230,auVar40,auVar47);
    auVar238._8_8_ = auVar54._0_8_;
    auVar238._0_8_ = auVar54._0_8_;
    auVar50 = vshufpd_avx(auVar54,auVar54,3);
    auVar50 = vsubps_avx512vl(auVar50,auVar238);
    auVar50 = vfmadd213ps_avx512vl(auVar50,auVar40,auVar238);
    auVar40 = vxorps_avx512vl(auVar47,auVar248._0_16_);
    auVar54 = vmovshdup_avx512vl(auVar50);
    auVar57 = vxorps_avx512vl(auVar54,auVar248._0_16_);
    auVar58 = vmovshdup_avx512vl(auVar47);
    auVar57 = vpermt2ps_avx512vl(auVar57,ZEXT416(5),auVar47);
    auVar247 = ZEXT464(0x40400000);
    auVar47 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar47._0_4_)),auVar50,auVar58);
    auVar40 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar40);
    auVar148._0_4_ = auVar47._0_4_;
    auVar148._4_4_ = auVar148._0_4_;
    auVar148._8_4_ = auVar148._0_4_;
    auVar148._12_4_ = auVar148._0_4_;
    auVar50 = vdivps_avx(auVar57,auVar148);
    auVar60 = vdivps_avx512vl(auVar40,auVar148);
    fVar216 = auVar63._0_4_;
    auVar40 = vshufps_avx(auVar63,auVar63,0x55);
    auVar231._0_4_ = fVar216 * auVar50._0_4_ + auVar40._0_4_ * auVar60._0_4_;
    auVar231._4_4_ = fVar216 * auVar50._4_4_ + auVar40._4_4_ * auVar60._4_4_;
    auVar231._8_4_ = fVar216 * auVar50._8_4_ + auVar40._8_4_ * auVar60._8_4_;
    auVar231._12_4_ = fVar216 * auVar50._12_4_ + auVar40._12_4_ * auVar60._12_4_;
    auVar58 = vsubps_avx(auVar43,auVar231);
    auVar40 = vmovshdup_avx(auVar50);
    auVar43 = vinsertps_avx(auVar190,auVar221,0x1c);
    auVar239._0_4_ = auVar40._0_4_ * auVar43._0_4_;
    auVar239._4_4_ = auVar40._4_4_ * auVar43._4_4_;
    auVar239._8_4_ = auVar40._8_4_ * auVar43._8_4_;
    auVar239._12_4_ = auVar40._12_4_ * auVar43._12_4_;
    auVar62 = vinsertps_avx512f(auVar178,auVar205,0x1c);
    auVar40 = vmulps_avx512vl(auVar40,auVar62);
    auVar57 = vminps_avx512vl(auVar239,auVar40);
    auVar63 = vmaxps_avx(auVar40,auVar239);
    auVar54 = vmovshdup_avx(auVar60);
    auVar40 = vinsertps_avx(auVar221,auVar190,0x4c);
    auVar222._0_4_ = auVar54._0_4_ * auVar40._0_4_;
    auVar222._4_4_ = auVar54._4_4_ * auVar40._4_4_;
    auVar222._8_4_ = auVar54._8_4_ * auVar40._8_4_;
    auVar222._12_4_ = auVar54._12_4_ * auVar40._12_4_;
    auVar47 = vinsertps_avx(auVar205,auVar178,0x4c);
    auVar206._0_4_ = auVar54._0_4_ * auVar47._0_4_;
    auVar206._4_4_ = auVar54._4_4_ * auVar47._4_4_;
    auVar206._8_4_ = auVar54._8_4_ * auVar47._8_4_;
    auVar206._12_4_ = auVar54._12_4_ * auVar47._12_4_;
    auVar54 = vminps_avx(auVar222,auVar206);
    auVar57 = vaddps_avx512vl(auVar57,auVar54);
    auVar54 = vmaxps_avx(auVar206,auVar222);
    auVar207._0_4_ = auVar63._0_4_ + auVar54._0_4_;
    auVar207._4_4_ = auVar63._4_4_ + auVar54._4_4_;
    auVar207._8_4_ = auVar63._8_4_ + auVar54._8_4_;
    auVar207._12_4_ = auVar63._12_4_ + auVar54._12_4_;
    auVar223._8_8_ = 0x3f80000000000000;
    auVar223._0_8_ = 0x3f80000000000000;
    auVar63 = vsubps_avx(auVar223,auVar207);
    auVar54 = vsubps_avx(auVar223,auVar57);
    auVar57 = vsubps_avx(auVar46,auVar56);
    auVar56 = vsubps_avx(auVar59,auVar56);
    fVar211 = auVar57._0_4_;
    auVar240._0_4_ = fVar211 * auVar63._0_4_;
    fVar213 = auVar57._4_4_;
    auVar240._4_4_ = fVar213 * auVar63._4_4_;
    fVar215 = auVar57._8_4_;
    auVar240._8_4_ = fVar215 * auVar63._8_4_;
    fVar217 = auVar57._12_4_;
    auVar240._12_4_ = fVar217 * auVar63._12_4_;
    auVar61 = vbroadcastss_avx512vl(auVar50);
    auVar43 = vmulps_avx512vl(auVar61,auVar43);
    auVar62 = vmulps_avx512vl(auVar61,auVar62);
    auVar61 = vminps_avx512vl(auVar43,auVar62);
    auVar62 = vmaxps_avx512vl(auVar62,auVar43);
    auVar43 = vbroadcastss_avx512vl(auVar60);
    auVar40 = vmulps_avx512vl(auVar43,auVar40);
    auVar43 = vmulps_avx512vl(auVar43,auVar47);
    auVar47 = vminps_avx512vl(auVar40,auVar43);
    auVar47 = vaddps_avx512vl(auVar61,auVar47);
    auVar57 = vmulps_avx512vl(auVar57,auVar54);
    fVar216 = auVar56._0_4_;
    auVar208._0_4_ = fVar216 * auVar63._0_4_;
    fVar201 = auVar56._4_4_;
    auVar208._4_4_ = fVar201 * auVar63._4_4_;
    fVar212 = auVar56._8_4_;
    auVar208._8_4_ = fVar212 * auVar63._8_4_;
    fVar214 = auVar56._12_4_;
    auVar208._12_4_ = fVar214 * auVar63._12_4_;
    auVar224._0_4_ = fVar216 * auVar54._0_4_;
    auVar224._4_4_ = fVar201 * auVar54._4_4_;
    auVar224._8_4_ = fVar212 * auVar54._8_4_;
    auVar224._12_4_ = fVar214 * auVar54._12_4_;
    auVar43 = vmaxps_avx(auVar43,auVar40);
    auVar179._0_4_ = auVar62._0_4_ + auVar43._0_4_;
    auVar179._4_4_ = auVar62._4_4_ + auVar43._4_4_;
    auVar179._8_4_ = auVar62._8_4_ + auVar43._8_4_;
    auVar179._12_4_ = auVar62._12_4_ + auVar43._12_4_;
    auVar191._8_8_ = 0x3f800000;
    auVar191._0_8_ = 0x3f800000;
    auVar43 = vsubps_avx(auVar191,auVar179);
    auVar40 = vsubps_avx512vl(auVar191,auVar47);
    auVar236._0_4_ = fVar211 * auVar43._0_4_;
    auVar236._4_4_ = fVar213 * auVar43._4_4_;
    auVar236._8_4_ = fVar215 * auVar43._8_4_;
    auVar236._12_4_ = fVar217 * auVar43._12_4_;
    auVar232._0_4_ = fVar211 * auVar40._0_4_;
    auVar232._4_4_ = fVar213 * auVar40._4_4_;
    auVar232._8_4_ = fVar215 * auVar40._8_4_;
    auVar232._12_4_ = fVar217 * auVar40._12_4_;
    auVar180._0_4_ = fVar216 * auVar43._0_4_;
    auVar180._4_4_ = fVar201 * auVar43._4_4_;
    auVar180._8_4_ = fVar212 * auVar43._8_4_;
    auVar180._12_4_ = fVar214 * auVar43._12_4_;
    auVar192._0_4_ = fVar216 * auVar40._0_4_;
    auVar192._4_4_ = fVar201 * auVar40._4_4_;
    auVar192._8_4_ = fVar212 * auVar40._8_4_;
    auVar192._12_4_ = fVar214 * auVar40._12_4_;
    auVar43 = vminps_avx(auVar236,auVar232);
    auVar40 = vminps_avx512vl(auVar180,auVar192);
    auVar47 = vminps_avx512vl(auVar43,auVar40);
    auVar43 = vmaxps_avx(auVar232,auVar236);
    auVar40 = vmaxps_avx(auVar192,auVar180);
    auVar40 = vmaxps_avx(auVar40,auVar43);
    auVar63 = vminps_avx512vl(auVar240,auVar57);
    auVar43 = vminps_avx(auVar208,auVar224);
    auVar43 = vminps_avx(auVar63,auVar43);
    auVar43 = vhaddps_avx(auVar47,auVar43);
    auVar86._0_16_ = vmaxps_avx512vl(auVar57,auVar240);
    auVar47 = vmaxps_avx(auVar224,auVar208);
    auVar47 = vmaxps_avx(auVar47,auVar86._0_16_);
    auVar40 = vhaddps_avx(auVar40,auVar47);
    auVar43 = vshufps_avx(auVar43,auVar43,0xe8);
    auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
    auVar181._0_4_ = auVar43._0_4_ + auVar58._0_4_;
    auVar181._4_4_ = auVar43._4_4_ + auVar58._4_4_;
    auVar181._8_4_ = auVar43._8_4_ + auVar58._8_4_;
    auVar181._12_4_ = auVar43._12_4_ + auVar58._12_4_;
    auVar193._0_4_ = auVar40._0_4_ + auVar58._0_4_;
    auVar193._4_4_ = auVar40._4_4_ + auVar58._4_4_;
    auVar193._8_4_ = auVar40._8_4_ + auVar58._8_4_;
    auVar193._12_4_ = auVar40._12_4_ + auVar58._12_4_;
    auVar43 = vmaxps_avx(auVar46,auVar181);
    auVar40 = vminps_avx(auVar193,auVar59);
    uVar28 = vcmpps_avx512vl(auVar40,auVar43,1);
  } while ((uVar28 & 3) != 0);
  uVar28 = vcmpps_avx512vl(auVar193,auVar59,1);
  uVar11 = vcmpps_avx512vl(auVar37,auVar181,1);
  if (((ushort)uVar11 & (ushort)uVar28 & 1) == 0) {
    bVar21 = 0;
  }
  else {
    auVar43 = vmovshdup_avx(auVar181);
    bVar21 = auVar52._0_4_ < auVar43._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
  }
  if (((!bVar32 || uVar4 != 0 && !bVar34) | bVar21) != 1) goto LAB_0181caec;
  lVar25 = 0xc9;
  do {
    lVar25 = lVar25 + -1;
    if (lVar25 == 0) goto LAB_0181bc0e;
    auVar37 = vsubss_avx512f(auVar41,auVar58);
    fVar212 = auVar37._0_4_;
    fVar216 = fVar212 * fVar212 * fVar212;
    auVar37 = vmulss_avx512f(auVar58,ZEXT416(0x40400000));
    fVar201 = auVar37._0_4_ * fVar212 * fVar212;
    fVar214 = auVar58._0_4_;
    auVar37 = vmulss_avx512f(ZEXT416((uint)(fVar214 * fVar214)),ZEXT416(0x40400000));
    fVar212 = fVar212 * auVar37._0_4_;
    auVar136._4_4_ = fVar216;
    auVar136._0_4_ = fVar216;
    auVar136._8_4_ = fVar216;
    auVar136._12_4_ = fVar216;
    auVar132._4_4_ = fVar201;
    auVar132._0_4_ = fVar201;
    auVar132._8_4_ = fVar201;
    auVar132._12_4_ = fVar201;
    auVar102._4_4_ = fVar212;
    auVar102._0_4_ = fVar212;
    auVar102._8_4_ = fVar212;
    auVar102._12_4_ = fVar212;
    fVar214 = fVar214 * fVar214 * fVar214;
    auVar161._0_4_ = (float)local_480._0_4_ * fVar214;
    auVar161._4_4_ = (float)local_480._4_4_ * fVar214;
    auVar161._8_4_ = fStack_478 * fVar214;
    auVar161._12_4_ = fStack_474 * fVar214;
    auVar37 = vfmadd231ps_fma(auVar161,auVar9,auVar102);
    auVar37 = vfmadd231ps_fma(auVar37,auVar49,auVar132);
    auVar37 = vfmadd231ps_fma(auVar37,auVar39,auVar136);
    auVar103._8_8_ = auVar37._0_8_;
    auVar103._0_8_ = auVar37._0_8_;
    auVar37 = vshufpd_avx(auVar37,auVar37,3);
    auVar43 = vshufps_avx(auVar58,auVar58,0x55);
    auVar37 = vsubps_avx(auVar37,auVar103);
    auVar43 = vfmadd213ps_fma(auVar37,auVar43,auVar103);
    fVar216 = auVar43._0_4_;
    auVar37 = vshufps_avx(auVar43,auVar43,0x55);
    auVar104._0_4_ = auVar50._0_4_ * fVar216 + auVar60._0_4_ * auVar37._0_4_;
    auVar104._4_4_ = auVar50._4_4_ * fVar216 + auVar60._4_4_ * auVar37._4_4_;
    auVar104._8_4_ = auVar50._8_4_ * fVar216 + auVar60._8_4_ * auVar37._8_4_;
    auVar104._12_4_ = auVar50._12_4_ * fVar216 + auVar60._12_4_ * auVar37._12_4_;
    auVar58 = vsubps_avx(auVar58,auVar104);
    auVar37 = vandps_avx512vl(auVar43,auVar245._0_16_);
    auVar86._0_16_ = vprolq_avx512vl(auVar37,0x20);
    auVar37 = vmaxss_avx(auVar86._0_16_,auVar37);
    bVar34 = (float)local_490._0_4_ < auVar37._0_4_;
  } while ((float)local_490._0_4_ <= auVar37._0_4_);
  auVar37 = vucomiss_avx512f(auVar55);
  if (bVar34) goto LAB_0181bc0e;
  auVar50 = vucomiss_avx512f(auVar37);
  auVar105 = ZEXT1664(auVar50);
  if (bVar34) goto LAB_0181bc0e;
  vmovshdup_avx(auVar37);
  auVar50 = vucomiss_avx512f(auVar55);
  if (bVar34) goto LAB_0181bc0e;
  auVar43 = vucomiss_avx512f(auVar50);
  auVar105 = ZEXT1664(auVar43);
  if (bVar34) goto LAB_0181bc0e;
  auVar40 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar57 = vinsertps_avx(auVar40,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar40 = vdpps_avx(auVar57,local_4a0,0x7f);
  auVar41 = vdpps_avx(auVar57,local_4b0,0x7f);
  auVar46 = vdpps_avx(auVar57,local_4c0,0x7f);
  auVar47 = vdpps_avx(auVar57,local_4d0,0x7f);
  auVar63 = vdpps_avx(auVar57,local_4e0,0x7f);
  auVar54 = vdpps_avx(auVar57,local_4f0,0x7f);
  auVar55 = vdpps_avx(auVar57,local_500,0x7f);
  auVar57 = vdpps_avx(auVar57,local_510,0x7f);
  auVar56 = vsubss_avx512f(auVar43,auVar50);
  fVar216 = auVar50._0_4_;
  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar63._0_4_)),auVar56,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar216)),auVar56,auVar41);
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar216)),auVar56,auVar46);
  auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar57._0_4_)),auVar56,auVar47);
  auVar43 = vsubss_avx512f(auVar43,auVar37);
  auVar162._0_4_ = auVar43._0_4_;
  fVar201 = auVar162._0_4_ * auVar162._0_4_ * auVar162._0_4_;
  auVar43 = vmulss_avx512f(auVar37,ZEXT416(0x40400000));
  fVar212 = auVar43._0_4_ * auVar162._0_4_ * auVar162._0_4_;
  fVar216 = auVar37._0_4_;
  auVar149._0_4_ = fVar216 * fVar216;
  auVar149._4_4_ = auVar37._4_4_ * auVar37._4_4_;
  auVar149._8_4_ = auVar37._8_4_ * auVar37._8_4_;
  auVar149._12_4_ = auVar37._12_4_ * auVar37._12_4_;
  auVar86._0_16_ = vmulss_avx512f(auVar149,ZEXT416(0x40400000));
  fVar214 = auVar162._0_4_ * auVar86._0_4_;
  fVar213 = fVar216 * auVar149._0_4_;
  auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * auVar46._0_4_)),ZEXT416((uint)fVar214),auVar41)
  ;
  auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar212),auVar40);
  auVar50 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar201),auVar50);
  fVar211 = auVar50._0_4_;
  if ((fVar211 < fVar99) || (fVar215 = *(float *)(ray + k * 4 + 0x200), fVar215 < fVar211))
  goto LAB_0181bc0e;
  auVar50 = vshufps_avx(auVar37,auVar37,0x55);
  auVar40 = vsubps_avx512vl(auVar48,auVar50);
  fVar217 = auVar50._0_4_;
  auVar194._0_4_ = fVar217 * (float)local_530._0_4_;
  fVar225 = auVar50._4_4_;
  auVar194._4_4_ = fVar225 * (float)local_530._4_4_;
  fVar226 = auVar50._8_4_;
  auVar194._8_4_ = fVar226 * fStack_528;
  fVar227 = auVar50._12_4_;
  auVar194._12_4_ = fVar227 * fStack_524;
  auVar198._0_4_ = fVar217 * (float)local_580._0_4_;
  auVar198._4_4_ = fVar225 * (float)local_580._4_4_;
  auVar198._8_4_ = fVar226 * fStack_578;
  auVar198._12_4_ = fVar227 * fStack_574;
  auVar209._0_4_ = fVar217 * (float)local_590._0_4_;
  auVar209._4_4_ = fVar225 * (float)local_590._4_4_;
  auVar209._8_4_ = fVar226 * fStack_588;
  auVar209._12_4_ = fVar227 * fStack_584;
  auVar173._0_4_ = fVar217 * (float)local_550._0_4_;
  auVar173._4_4_ = fVar225 * (float)local_550._4_4_;
  auVar173._8_4_ = fVar226 * fStack_548;
  auVar173._12_4_ = fVar227 * fStack_544;
  auVar50 = vfmadd231ps_fma(auVar194,auVar40,local_520);
  auVar48 = vfmadd231ps_fma(auVar198,auVar40,local_560);
  auVar43 = vfmadd231ps_fma(auVar209,auVar40,local_570);
  auVar40 = vfmadd231ps_fma(auVar173,auVar40,local_540);
  auVar50 = vsubps_avx(auVar48,auVar50);
  auVar48 = vsubps_avx(auVar43,auVar48);
  auVar43 = vsubps_avx(auVar40,auVar43);
  auVar210._0_4_ = fVar216 * auVar48._0_4_;
  auVar210._4_4_ = fVar216 * auVar48._4_4_;
  auVar210._8_4_ = fVar216 * auVar48._8_4_;
  auVar210._12_4_ = fVar216 * auVar48._12_4_;
  auVar162._4_4_ = auVar162._0_4_;
  auVar162._8_4_ = auVar162._0_4_;
  auVar162._12_4_ = auVar162._0_4_;
  auVar50 = vfmadd231ps_fma(auVar210,auVar162,auVar50);
  auVar174._0_4_ = fVar216 * auVar43._0_4_;
  auVar174._4_4_ = fVar216 * auVar43._4_4_;
  auVar174._8_4_ = fVar216 * auVar43._8_4_;
  auVar174._12_4_ = fVar216 * auVar43._12_4_;
  auVar48 = vfmadd231ps_fma(auVar174,auVar162,auVar48);
  auVar175._0_4_ = fVar216 * auVar48._0_4_;
  auVar175._4_4_ = fVar216 * auVar48._4_4_;
  auVar175._8_4_ = fVar216 * auVar48._8_4_;
  auVar175._12_4_ = fVar216 * auVar48._12_4_;
  auVar50 = vfmadd231ps_fma(auVar175,auVar162,auVar50);
  auVar16._8_4_ = 0x40400000;
  auVar16._0_8_ = 0x4040000040400000;
  auVar16._12_4_ = 0x40400000;
  auVar86._0_16_ = vmulps_avx512vl(auVar50,auVar16);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar21 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0181cad9;
    auVar150._0_4_ = fVar213 * (float)local_5e0._0_4_;
    auVar150._4_4_ = fVar213 * (float)local_5e0._4_4_;
    auVar150._8_4_ = fVar213 * fStack_5d8;
    auVar150._12_4_ = fVar213 * fStack_5d4;
    auVar137._4_4_ = fVar214;
    auVar137._0_4_ = fVar214;
    auVar137._8_4_ = fVar214;
    auVar137._12_4_ = fVar214;
    auVar50 = vfmadd132ps_fma(auVar137,auVar150,local_5d0);
    auVar133._4_4_ = fVar212;
    auVar133._0_4_ = fVar212;
    auVar133._8_4_ = fVar212;
    auVar133._12_4_ = fVar212;
    auVar50 = vfmadd132ps_fma(auVar133,auVar50,local_5c0);
    auVar119._4_4_ = fVar201;
    auVar119._0_4_ = fVar201;
    auVar119._8_4_ = fVar201;
    auVar119._12_4_ = fVar201;
    auVar43 = vfmadd132ps_fma(auVar119,auVar50,local_5b0);
    auVar50 = vshufps_avx(auVar43,auVar43,0xc9);
    auVar48 = vshufps_avx(auVar86._0_16_,auVar86._0_16_,0xc9);
    auVar120._0_4_ = auVar43._0_4_ * auVar48._0_4_;
    auVar120._4_4_ = auVar43._4_4_ * auVar48._4_4_;
    auVar120._8_4_ = auVar43._8_4_ * auVar48._8_4_;
    auVar120._12_4_ = auVar43._12_4_ * auVar48._12_4_;
    auVar50 = vfmsub231ps_fma(auVar120,auVar86._0_16_,auVar50);
    local_200 = vbroadcastss_avx512f(auVar37);
    auVar105 = vbroadcastss_avx512f(ZEXT416(1));
    local_1c0 = vpermps_avx512f(auVar105,ZEXT1664(auVar37));
    auVar105 = vpermps_avx512f(auVar105,ZEXT1664(auVar50));
    auVar246 = vbroadcastss_avx512f(ZEXT416(2));
    local_280 = vpermps_avx512f(auVar246,ZEXT1664(auVar50));
    local_240 = vbroadcastss_avx512f(auVar50);
    local_2c0[0] = (RTCHitN)auVar105[0];
    local_2c0[1] = (RTCHitN)auVar105[1];
    local_2c0[2] = (RTCHitN)auVar105[2];
    local_2c0[3] = (RTCHitN)auVar105[3];
    local_2c0[4] = (RTCHitN)auVar105[4];
    local_2c0[5] = (RTCHitN)auVar105[5];
    local_2c0[6] = (RTCHitN)auVar105[6];
    local_2c0[7] = (RTCHitN)auVar105[7];
    local_2c0[8] = (RTCHitN)auVar105[8];
    local_2c0[9] = (RTCHitN)auVar105[9];
    local_2c0[10] = (RTCHitN)auVar105[10];
    local_2c0[0xb] = (RTCHitN)auVar105[0xb];
    local_2c0[0xc] = (RTCHitN)auVar105[0xc];
    local_2c0[0xd] = (RTCHitN)auVar105[0xd];
    local_2c0[0xe] = (RTCHitN)auVar105[0xe];
    local_2c0[0xf] = (RTCHitN)auVar105[0xf];
    local_2c0[0x10] = (RTCHitN)auVar105[0x10];
    local_2c0[0x11] = (RTCHitN)auVar105[0x11];
    local_2c0[0x12] = (RTCHitN)auVar105[0x12];
    local_2c0[0x13] = (RTCHitN)auVar105[0x13];
    local_2c0[0x14] = (RTCHitN)auVar105[0x14];
    local_2c0[0x15] = (RTCHitN)auVar105[0x15];
    local_2c0[0x16] = (RTCHitN)auVar105[0x16];
    local_2c0[0x17] = (RTCHitN)auVar105[0x17];
    local_2c0[0x18] = (RTCHitN)auVar105[0x18];
    local_2c0[0x19] = (RTCHitN)auVar105[0x19];
    local_2c0[0x1a] = (RTCHitN)auVar105[0x1a];
    local_2c0[0x1b] = (RTCHitN)auVar105[0x1b];
    local_2c0[0x1c] = (RTCHitN)auVar105[0x1c];
    local_2c0[0x1d] = (RTCHitN)auVar105[0x1d];
    local_2c0[0x1e] = (RTCHitN)auVar105[0x1e];
    local_2c0[0x1f] = (RTCHitN)auVar105[0x1f];
    local_2c0[0x20] = (RTCHitN)auVar105[0x20];
    local_2c0[0x21] = (RTCHitN)auVar105[0x21];
    local_2c0[0x22] = (RTCHitN)auVar105[0x22];
    local_2c0[0x23] = (RTCHitN)auVar105[0x23];
    local_2c0[0x24] = (RTCHitN)auVar105[0x24];
    local_2c0[0x25] = (RTCHitN)auVar105[0x25];
    local_2c0[0x26] = (RTCHitN)auVar105[0x26];
    local_2c0[0x27] = (RTCHitN)auVar105[0x27];
    local_2c0[0x28] = (RTCHitN)auVar105[0x28];
    local_2c0[0x29] = (RTCHitN)auVar105[0x29];
    local_2c0[0x2a] = (RTCHitN)auVar105[0x2a];
    local_2c0[0x2b] = (RTCHitN)auVar105[0x2b];
    local_2c0[0x2c] = (RTCHitN)auVar105[0x2c];
    local_2c0[0x2d] = (RTCHitN)auVar105[0x2d];
    local_2c0[0x2e] = (RTCHitN)auVar105[0x2e];
    local_2c0[0x2f] = (RTCHitN)auVar105[0x2f];
    local_2c0[0x30] = (RTCHitN)auVar105[0x30];
    local_2c0[0x31] = (RTCHitN)auVar105[0x31];
    local_2c0[0x32] = (RTCHitN)auVar105[0x32];
    local_2c0[0x33] = (RTCHitN)auVar105[0x33];
    local_2c0[0x34] = (RTCHitN)auVar105[0x34];
    local_2c0[0x35] = (RTCHitN)auVar105[0x35];
    local_2c0[0x36] = (RTCHitN)auVar105[0x36];
    local_2c0[0x37] = (RTCHitN)auVar105[0x37];
    local_2c0[0x38] = (RTCHitN)auVar105[0x38];
    local_2c0[0x39] = (RTCHitN)auVar105[0x39];
    local_2c0[0x3a] = (RTCHitN)auVar105[0x3a];
    local_2c0[0x3b] = (RTCHitN)auVar105[0x3b];
    local_2c0[0x3c] = (RTCHitN)auVar105[0x3c];
    local_2c0[0x3d] = (RTCHitN)auVar105[0x3d];
    local_2c0[0x3e] = (RTCHitN)auVar105[0x3e];
    local_2c0[0x3f] = (RTCHitN)auVar105[0x3f];
    local_180 = local_300._0_8_;
    uStack_178 = local_300._8_8_;
    uStack_170 = local_300._16_8_;
    uStack_168 = local_300._24_8_;
    uStack_160 = local_300._32_8_;
    uStack_158 = local_300._40_8_;
    uStack_150 = local_300._48_8_;
    uStack_148 = local_300._56_8_;
    auVar105 = vmovdqa64_avx512f(local_340);
    local_140 = vmovdqa64_avx512f(auVar105);
    vpcmpeqd_avx2(auVar105._0_32_,auVar105._0_32_);
    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
    *(float *)(ray + k * 4 + 0x200) = fVar211;
    auVar85 = vmovdqa64_avx512f(local_380);
    local_400 = vmovdqa64_avx512f(auVar85);
    local_610.valid = (int *)local_400;
    local_610.geometryUserPtr = pGVar5->userPtr;
    local_610.context = context->user;
    local_610.ray = (RTCRayN *)ray;
    local_610.hit = local_2c0;
    local_610.N = 0x10;
    if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar5->occlusionFilterN)(&local_610);
      auVar244 = ZEXT3264(_DAT_01fb9fe0);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar243 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar248 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar245 = ZEXT1664(auVar37);
      auVar85 = vmovdqa64_avx512f(local_400);
    }
    uVar11 = vptestmd_avx512f(auVar85,auVar85);
    auVar86._32_32_ = auVar85._32_32_;
    if ((short)uVar11 == 0) {
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar246 = ZEXT1664(auVar37);
      auVar86._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar242 = ZEXT3264(auVar86._0_32_);
    }
    else {
      p_Var6 = context->args->filter;
      if (p_Var6 == (RTCFilterFunctionN)0x0) {
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar246 = ZEXT1664(auVar37);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar242 = ZEXT3264(auVar81);
      }
      else {
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar246 = ZEXT1664(auVar37);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar242 = ZEXT3264(auVar81);
        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
             RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
          (*p_Var6)(&local_610);
          auVar244 = ZEXT3264(_DAT_01fb9fe0);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
          auVar243 = ZEXT1664(auVar37);
          auVar85._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
          auVar242 = ZEXT3264(auVar85._32_32_);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar248 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar246 = ZEXT1664(auVar37);
          auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar245 = ZEXT1664(auVar37);
          auVar85 = vmovdqa64_avx512f(local_400);
        }
      }
      auVar105 = ZEXT464(0x3f800000);
      uVar28 = vptestmd_avx512f(auVar85,auVar85);
      auVar85 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar34 = (bool)((byte)uVar28 & 1);
      auVar86._0_4_ = (uint)bVar34 * auVar85._0_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x200)
      ;
      bVar34 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar86._4_4_ = (uint)bVar34 * auVar85._4_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x204)
      ;
      bVar34 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar86._8_4_ = (uint)bVar34 * auVar85._8_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x208)
      ;
      bVar34 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar86._12_4_ =
           (uint)bVar34 * auVar85._12_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x20c);
      bVar34 = (bool)((byte)(uVar28 >> 4) & 1);
      auVar86._16_4_ =
           (uint)bVar34 * auVar85._16_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x210);
      bVar34 = (bool)((byte)(uVar28 >> 5) & 1);
      auVar86._20_4_ =
           (uint)bVar34 * auVar85._20_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x214);
      bVar34 = (bool)((byte)(uVar28 >> 6) & 1);
      auVar86._24_4_ =
           (uint)bVar34 * auVar85._24_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x218);
      bVar34 = (bool)((byte)(uVar28 >> 7) & 1);
      auVar86._28_4_ =
           (uint)bVar34 * auVar85._28_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x21c);
      bVar34 = (bool)((byte)(uVar28 >> 8) & 1);
      auVar86._32_4_ =
           (uint)bVar34 * auVar85._32_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x220);
      bVar34 = (bool)((byte)(uVar28 >> 9) & 1);
      auVar86._36_4_ =
           (uint)bVar34 * auVar85._36_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x224);
      bVar34 = (bool)((byte)(uVar28 >> 10) & 1);
      auVar86._40_4_ =
           (uint)bVar34 * auVar85._40_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x228);
      bVar34 = (bool)((byte)(uVar28 >> 0xb) & 1);
      auVar86._44_4_ =
           (uint)bVar34 * auVar85._44_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x22c);
      bVar34 = (bool)((byte)(uVar28 >> 0xc) & 1);
      auVar86._48_4_ =
           (uint)bVar34 * auVar85._48_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x230);
      bVar34 = (bool)((byte)(uVar28 >> 0xd) & 1);
      auVar86._52_4_ =
           (uint)bVar34 * auVar85._52_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x234);
      bVar34 = (bool)((byte)(uVar28 >> 0xe) & 1);
      auVar86._56_4_ =
           (uint)bVar34 * auVar85._56_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x238);
      bVar34 = SUB81(uVar28 >> 0xf,0);
      auVar86._60_4_ =
           (uint)bVar34 * auVar85._60_4_ | (uint)!bVar34 * *(int *)(local_610.ray + 0x23c);
      *(undefined1 (*) [64])(local_610.ray + 0x200) = auVar86;
      bVar21 = 1;
      if ((short)uVar28 != 0) goto LAB_0181cad9;
    }
    auVar105 = ZEXT464(0x3f800000);
    *(float *)(ray + k * 4 + 0x200) = fVar215;
  }
  bVar21 = 0;
LAB_0181cad9:
  bVar31 = (bool)(bVar31 | bVar21);
  goto LAB_0181bc0e;
LAB_0181caec:
  auVar111 = vinsertps_avx(auVar52,auVar53,0x10);
  goto LAB_0181b6c8;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }